

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  size_t k;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  uint uVar61;
  int iVar62;
  AABBNodeMB4D *node1;
  ulong uVar63;
  long lVar64;
  long lVar65;
  uint uVar66;
  long lVar67;
  ulong uVar68;
  long lVar69;
  long lVar70;
  ulong *puVar71;
  undefined1 (*pauVar72) [32];
  ulong uVar73;
  RayK<8> *pRVar74;
  ulong uVar75;
  undefined4 uVar76;
  ulong unaff_R14;
  long lVar77;
  RayQueryContext *pRVar78;
  bool bVar79;
  float fVar80;
  float fVar96;
  float fVar97;
  __m128 a;
  float fVar98;
  undefined1 auVar84 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar81 [16];
  undefined1 auVar87 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [32];
  undefined1 auVar104 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar117 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar130 [16];
  undefined1 auVar138 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar146 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar161 [16];
  undefined1 auVar165 [32];
  undefined1 auVar162 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar173 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar194 [16];
  float fVar193;
  float fVar199;
  float fVar200;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar201;
  undefined1 auVar198 [32];
  float fVar205;
  undefined1 auVar206 [16];
  float fVar211;
  float fVar212;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar213;
  undefined1 auVar210 [32];
  undefined1 auVar214 [32];
  float fVar215;
  undefined1 auVar216 [32];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 in_ZMM13 [64];
  undefined1 auVar217 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  UVIdentity<8> mapUV;
  Precalculations pre;
  vbool<8> terminated;
  RTCFilterFunctionNArguments args;
  vbool<8> valid0;
  PlueckerHitM<8,_embree::avx2::UVIdentity<8>_> hit;
  TravRayK<8,_true> tray;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2f16;
  Precalculations local_2f15;
  uint local_2f14;
  ulong local_2f10;
  undefined1 (*local_2f08) [32];
  ulong *local_2f00;
  uint local_2ef8;
  uint local_2ef4;
  RayK<8> *local_2ef0;
  ulong local_2ee8;
  undefined1 local_2ee0 [8];
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float fStack_2ec4;
  undefined1 local_2ec0 [32];
  undefined1 local_2ea0 [32];
  undefined1 local_2e80 [32];
  undefined1 local_2e60 [32];
  BVH *local_2e38;
  Intersectors *local_2e30;
  long local_2e28;
  long local_2e20;
  ulong local_2e18;
  long local_2e10;
  ulong local_2e08;
  RayK<8> *local_2e00;
  RayQueryContext *local_2df8;
  ulong local_2df0;
  ulong local_2de8;
  long local_2de0;
  long local_2dd8;
  Scene *local_2dd0;
  long local_2dc8;
  undefined1 local_2dc0 [32];
  RTCFilterFunctionNArguments local_2d90;
  undefined1 local_2d60 [32];
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [8];
  float fStack_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  undefined1 local_2cc0 [8];
  float fStack_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float fStack_2ca8;
  float fStack_2ca4;
  undefined1 local_2ca0 [32];
  undefined1 *local_2c80;
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  float local_2be0 [4];
  float fStack_2bd0;
  float fStack_2bcc;
  float fStack_2bc8;
  undefined4 uStack_2bc4;
  float local_2bc0 [4];
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  undefined4 uStack_2ba4;
  float local_2ba0 [4];
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  undefined4 uStack_2b84;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2b80;
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [8];
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  undefined1 local_2aa0 [8];
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  undefined1 local_2a80 [8];
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  undefined1 local_29e0 [32];
  RTCHitN local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined4 local_2960;
  undefined4 uStack_295c;
  undefined4 uStack_2958;
  undefined4 uStack_2954;
  undefined4 uStack_2950;
  undefined4 uStack_294c;
  undefined4 uStack_2948;
  undefined4 uStack_2944;
  undefined4 local_2940;
  undefined4 uStack_293c;
  undefined4 uStack_2938;
  undefined4 uStack_2934;
  undefined4 uStack_2930;
  undefined4 uStack_292c;
  undefined4 uStack_2928;
  undefined4 uStack_2924;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  uint local_2880;
  uint uStack_287c;
  uint uStack_2878;
  uint uStack_2874;
  uint uStack_2870;
  uint uStack_286c;
  uint uStack_2868;
  uint uStack_2864;
  uint local_2860;
  uint uStack_285c;
  uint uStack_2858;
  uint uStack_2854;
  uint uStack_2850;
  uint uStack_284c;
  uint uStack_2848;
  uint uStack_2844;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [8];
  float fStack_2798;
  float fStack_2794;
  float fStack_2790;
  float fStack_278c;
  float fStack_2788;
  undefined1 local_2780 [8];
  float fStack_2778;
  float fStack_2774;
  float fStack_2770;
  float fStack_276c;
  float fStack_2768;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined4 local_1e80;
  undefined4 uStack_1e7c;
  undefined4 uStack_1e78;
  undefined4 uStack_1e74;
  undefined4 uStack_1e70;
  undefined4 uStack_1e6c;
  undefined4 uStack_1e68;
  undefined4 uStack_1e64;
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2e38 = (BVH *)This->ptr;
  if ((local_2e38->root).ptr != 8) {
    auVar134 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar81 = ZEXT816(0) << 0x40;
    auVar85 = vpcmpeqd_avx2(auVar134,(undefined1  [32])valid_i->field_0);
    auVar134 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar81),5);
    auVar107 = auVar85 & auVar134;
    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar107 >> 0x7f,0) != '\0') ||
          (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar107 >> 0xbf,0) != '\0') ||
        (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar107[0x1f] < '\0') {
      auVar134 = vandps_avx(auVar134,auVar85);
      auVar102 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
      local_2b80._0_8_ = *(undefined8 *)ray;
      local_2b80._8_8_ = *(undefined8 *)(ray + 8);
      local_2b80._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2b80._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2b80._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2b80._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2b80._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2b80._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2b80._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2b80._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2b80._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2b80._88_8_ = *(undefined8 *)(ray + 0x58);
      local_2b20 = *(undefined1 (*) [32])(ray + 0x80);
      local_2b00 = *(undefined1 (*) [32])(ray + 0xa0);
      local_2ae0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2d20._8_4_ = 0x7fffffff;
      local_2d20._0_8_ = 0x7fffffff7fffffff;
      local_2d20._12_4_ = 0x7fffffff;
      local_2d20._16_4_ = 0x7fffffff;
      local_2d20._20_4_ = 0x7fffffff;
      local_2d20._24_4_ = 0x7fffffff;
      local_2d20._28_4_ = 0x7fffffff;
      auVar207._8_4_ = 0x219392ef;
      auVar207._0_8_ = 0x219392ef219392ef;
      auVar207._12_4_ = 0x219392ef;
      auVar207._16_4_ = 0x219392ef;
      auVar207._20_4_ = 0x219392ef;
      auVar207._24_4_ = 0x219392ef;
      auVar207._28_4_ = 0x219392ef;
      auVar142._8_4_ = 0x3f800000;
      auVar142._0_8_ = &DAT_3f8000003f800000;
      auVar142._12_4_ = 0x3f800000;
      auVar142._16_4_ = 0x3f800000;
      auVar142._20_4_ = 0x3f800000;
      auVar142._24_4_ = 0x3f800000;
      auVar142._28_4_ = 0x3f800000;
      auVar133 = vdivps_avx(auVar142,local_2b20);
      auVar134 = vandps_avx(local_2d20,local_2b20);
      auVar107 = vcmpps_avx(auVar134,auVar207,1);
      auVar134 = vandps_avx(local_2d20,local_2b00);
      auVar85 = vcmpps_avx(auVar134,auVar207,1);
      auVar106 = vdivps_avx(auVar142,local_2b00);
      auVar134 = vandps_avx(local_2d20,local_2ae0);
      auVar134 = vcmpps_avx(auVar134,auVar207,1);
      auVar148 = vdivps_avx(auVar142,local_2ae0);
      auVar208._8_4_ = 0x5d5e0b6b;
      auVar208._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar208._12_4_ = 0x5d5e0b6b;
      auVar208._16_4_ = 0x5d5e0b6b;
      auVar208._20_4_ = 0x5d5e0b6b;
      auVar208._24_4_ = 0x5d5e0b6b;
      auVar208._28_4_ = 0x5d5e0b6b;
      _local_2ac0 = vblendvps_avx(auVar133,auVar208,auVar107);
      _local_2aa0 = vblendvps_avx(auVar106,auVar208,auVar85);
      _local_2a80 = vblendvps_avx(auVar148,auVar208,auVar134);
      auVar134 = vcmpps_avx(_local_2ac0,ZEXT1632(auVar81),1);
      auVar107._8_4_ = 0x10;
      auVar107._0_8_ = 0x1000000010;
      auVar107._12_4_ = 0x10;
      auVar107._16_4_ = 0x10;
      auVar107._20_4_ = 0x10;
      auVar107._24_4_ = 0x10;
      auVar107._28_4_ = 0x10;
      local_2a60 = vandps_avx(auVar134,auVar107);
      auVar133._8_4_ = 0x20;
      auVar133._0_8_ = 0x2000000020;
      auVar133._12_4_ = 0x20;
      auVar133._16_4_ = 0x20;
      auVar133._20_4_ = 0x20;
      auVar133._24_4_ = 0x20;
      auVar133._28_4_ = 0x20;
      auVar174._8_4_ = 0x30;
      auVar174._0_8_ = 0x3000000030;
      auVar174._12_4_ = 0x30;
      auVar174._16_4_ = 0x30;
      auVar174._20_4_ = 0x30;
      auVar174._24_4_ = 0x30;
      auVar174._28_4_ = 0x30;
      auVar107 = ZEXT1632(auVar81);
      auVar134 = vcmpps_avx(_local_2aa0,auVar107,5);
      local_2a40 = vblendvps_avx(auVar174,auVar133,auVar134);
      auVar106._8_4_ = 0x40;
      auVar106._0_8_ = 0x4000000040;
      auVar106._12_4_ = 0x40;
      auVar106._16_4_ = 0x40;
      auVar106._20_4_ = 0x40;
      auVar106._24_4_ = 0x40;
      auVar106._28_4_ = 0x40;
      auVar148._8_4_ = 0x50;
      auVar148._0_8_ = 0x5000000050;
      auVar148._12_4_ = 0x50;
      auVar148._16_4_ = 0x50;
      auVar148._20_4_ = 0x50;
      auVar148._24_4_ = 0x50;
      auVar148._28_4_ = 0x50;
      auVar134 = vcmpps_avx(_local_2a80,auVar107,5);
      local_2a20 = vblendvps_avx(auVar148,auVar106,auVar134);
      auVar134 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar107);
      auVar107 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar107);
      local_28a0 = vpmovsxwd_avx2(auVar102);
      auVar85._8_4_ = 0x7f800000;
      auVar85._0_8_ = 0x7f8000007f800000;
      auVar85._12_4_ = 0x7f800000;
      auVar85._16_4_ = 0x7f800000;
      auVar85._20_4_ = 0x7f800000;
      auVar85._24_4_ = 0x7f800000;
      auVar85._28_4_ = 0x7f800000;
      local_2a00 = vblendvps_avx(auVar85,auVar134,local_28a0);
      auVar134._8_4_ = 0xff800000;
      auVar134._0_8_ = 0xff800000ff800000;
      auVar134._12_4_ = 0xff800000;
      auVar134._16_4_ = 0xff800000;
      auVar134._20_4_ = 0xff800000;
      auVar134._24_4_ = 0xff800000;
      auVar134._28_4_ = 0xff800000;
      local_29e0 = vblendvps_avx(auVar134,auVar107,local_28a0);
      auVar81 = vpcmpeqd_avx(local_29e0._0_16_,local_29e0._0_16_);
      local_2dc0 = vpmovsxwd_avx2(auVar102 ^ auVar81);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar75 = 5;
      }
      else {
        uVar75 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2ef0 = ray + 0x100;
      puVar71 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar72 = (undefined1 (*) [32])local_1e40;
      local_1e80 = 0x7f800000;
      uStack_1e7c = 0x7f800000;
      uStack_1e78 = 0x7f800000;
      uStack_1e74 = 0x7f800000;
      uStack_1e70 = 0x7f800000;
      uStack_1e6c = 0x7f800000;
      uStack_1e68 = 0x7f800000;
      uStack_1e64 = 0x7f800000;
      local_2608 = (local_2e38->root).ptr;
      local_1e60 = local_2a00;
      local_27c0._16_16_ = mm_lookupmask_ps._240_16_;
      local_27c0._0_16_ = mm_lookupmask_ps._0_16_;
      auVar86._8_4_ = 0xbf800000;
      auVar86._0_8_ = 0xbf800000bf800000;
      auVar86._12_4_ = 0xbf800000;
      auVar86._16_4_ = 0xbf800000;
      auVar86._20_4_ = 0xbf800000;
      auVar86._24_4_ = 0xbf800000;
      auVar86._28_4_ = 0xbf800000;
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = &DAT_3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar105._16_4_ = 0x3f800000;
      auVar105._20_4_ = 0x3f800000;
      auVar105._24_4_ = 0x3f800000;
      auVar105._28_4_ = 0x3f800000;
      _local_27e0 = vblendvps_avx(auVar105,auVar86,local_27c0);
      local_2e30 = This;
      do {
        pauVar72 = pauVar72 + -1;
        local_2f10 = puVar71[-1];
        puVar71 = puVar71 + -1;
        if (local_2f10 == 0xfffffffffffffff8) {
LAB_005cb8c1:
          iVar62 = 3;
        }
        else {
          auVar134 = *pauVar72;
          auVar115 = ZEXT3264(auVar134);
          auVar107 = vcmpps_avx(auVar134,local_29e0,1);
          if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar107 >> 0x7f,0) == '\0') &&
                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar107 >> 0xbf,0) == '\0') &&
              (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar107[0x1f]) {
LAB_005cb8d2:
            iVar62 = 2;
          }
          else {
            uVar76 = vmovmskps_avx(auVar107);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar76);
            iVar62 = 0;
            if ((uint)POPCOUNT(uVar76) <= uVar75) {
              for (; local_2d60 = auVar134, unaff_R14 != 0; unaff_R14 = unaff_R14 - 1 & unaff_R14) {
                k = 0;
                for (uVar68 = unaff_R14; (uVar68 & 1) == 0;
                    uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                  k = k + 1;
                }
                local_2ea0._0_8_ = k;
                in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                local_2f08 = pauVar72;
                local_2f00 = puVar71;
                bVar79 = occluded1(local_2e30,local_2e38,(NodeRef)local_2f10,k,&local_2f15,ray,
                                   (TravRayK<8,_true> *)&local_2b80.field_0,context);
                if (bVar79) {
                  *(undefined4 *)(local_2dc0 + local_2ea0._0_8_ * 4) = 0xffffffff;
                }
                auVar115 = ZEXT3264(local_2d60);
                pauVar72 = local_2f08;
                puVar71 = local_2f00;
                auVar134 = local_2d60;
              }
              auVar134 = _DAT_0205a980 & ~local_2dc0;
              iVar62 = 3;
              unaff_R14 = 0;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar134 >> 0x7f,0) != '\0') ||
                    (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar134 >> 0xbf,0) != '\0') ||
                  (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar134[0x1f] < '\0') {
                auVar128._8_4_ = 0xff800000;
                auVar128._0_8_ = 0xff800000ff800000;
                auVar128._12_4_ = 0xff800000;
                auVar128._16_4_ = 0xff800000;
                auVar128._20_4_ = 0xff800000;
                auVar128._24_4_ = 0xff800000;
                auVar128._28_4_ = 0xff800000;
                local_29e0 = vblendvps_avx(local_29e0,auVar128,local_2dc0);
                auVar115 = ZEXT3264(local_2d60);
                iVar62 = 2;
              }
            }
            if ((uint)uVar75 < (uint)POPCOUNT(uVar76)) {
              do {
                uVar66 = (uint)local_2f10;
                auVar134 = auVar115._0_32_;
                if ((local_2f10 & 8) != 0) {
                  if (local_2f10 == 0xfffffffffffffff8) goto LAB_005cb8c1;
                  auVar107 = vcmpps_avx(local_29e0,auVar134,6);
                  if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar107 >> 0x7f,0) != '\0') ||
                        (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar107 >> 0xbf,0) != '\0') ||
                      (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar107[0x1f] < '\0') {
                    local_2e28 = (ulong)(uVar66 & 0xf) - 8;
                    if (local_2e28 == 0) {
                      auVar134 = vpcmpeqd_avx2(auVar134,auVar134);
                      auVar95 = local_2dc0;
                    }
                    else {
                      uVar68 = local_2f10 & 0xfffffffffffffff0;
                      auVar115 = ZEXT3264(CONCAT428(local_2dc0._28_4_ ^ 0xffffffff,
                                                    CONCAT424(local_2dc0._24_4_ ^ 0xffffffff,
                                                              CONCAT420(local_2dc0._20_4_ ^
                                                                        0xffffffff,
                                                                        CONCAT416(local_2dc0._16_4_
                                                                                  ^ 0xffffffff,
                                                                                  CONCAT412(
                                                  local_2dc0._12_4_ ^ 0xffffffff,
                                                  CONCAT48(local_2dc0._8_4_ ^ 0xffffffff,
                                                           local_2dc0._0_8_ ^ 0xffffffffffffffff))))
                                                  )));
                      lVar65 = 0;
                      local_2f10 = uVar68;
                      local_2f08 = pauVar72;
                      local_2f00 = puVar71;
                      local_2e18 = uVar75;
                      local_2e00 = ray;
                      local_2df8 = context;
                      do {
                        lVar64 = lVar65 * 0x90;
                        auVar81._8_8_ = 0;
                        auVar81._0_8_ = *(ulong *)(uVar68 + 0x20 + lVar64);
                        auVar102._8_8_ = 0;
                        auVar102._0_8_ = *(ulong *)(uVar68 + 0x24 + lVar64);
                        auVar102 = vpminub_avx(auVar81,auVar102);
                        auVar81 = vpcmpeqb_avx(auVar81,auVar102);
                        auVar102 = vpcmpeqd_avx(auVar102,auVar102);
                        auVar134 = ZEXT1632(auVar102);
                        auVar81 = vpmovzxbd_avx(auVar81 ^ auVar102);
                        auVar81 = vpslld_avx(auVar81 ^ auVar102,0x1f);
                        uVar66 = vmovmskps_avx(auVar81);
                        local_2e20 = lVar65;
                        if (uVar66 != 0) {
                          lVar65 = uVar68 + lVar64;
                          uVar76 = *(undefined4 *)(uVar68 + 0x80 + lVar64);
                          auVar87._4_4_ = uVar76;
                          auVar87._0_4_ = uVar76;
                          auVar87._8_4_ = uVar76;
                          auVar87._12_4_ = uVar76;
                          auVar87._16_4_ = uVar76;
                          auVar87._20_4_ = uVar76;
                          auVar87._24_4_ = uVar76;
                          auVar87._28_4_ = uVar76;
                          auVar134 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar87);
                          fVar1 = *(float *)(uVar68 + 0x84 + lVar64);
                          auVar217._0_4_ = fVar1 * auVar134._0_4_;
                          auVar217._4_4_ = fVar1 * auVar134._4_4_;
                          auVar217._8_4_ = fVar1 * auVar134._8_4_;
                          auVar217._12_4_ = fVar1 * auVar134._12_4_;
                          auVar217._16_4_ = fVar1 * auVar134._16_4_;
                          auVar217._20_4_ = fVar1 * auVar134._20_4_;
                          auVar217._28_36_ = in_ZMM13._28_36_;
                          auVar217._24_4_ = fVar1 * auVar134._24_4_;
                          in_ZMM13 = ZEXT3264(auVar217._0_32_);
                          uVar73 = (ulong)(uVar66 & 0xff);
                          local_2840 = auVar217._0_32_;
                          local_2e10 = lVar65;
                          do {
                            lVar64 = 0;
                            for (uVar63 = uVar73; (uVar63 & 1) == 0;
                                uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                              lVar64 = lVar64 + 1;
                            }
                            auVar82._8_8_ = 0;
                            auVar82._0_8_ = *(ulong *)(lVar65 + 0x20);
                            auVar81 = vpmovzxbd_avx(auVar82);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            uVar76 = *(undefined4 *)(lVar65 + 0x44);
                            auVar103._4_4_ = uVar76;
                            auVar103._0_4_ = uVar76;
                            auVar103._8_4_ = uVar76;
                            auVar103._12_4_ = uVar76;
                            uVar76 = *(undefined4 *)(lVar65 + 0x38);
                            auVar116._4_4_ = uVar76;
                            auVar116._0_4_ = uVar76;
                            auVar116._8_4_ = uVar76;
                            auVar116._12_4_ = uVar76;
                            auVar81 = vfmadd213ps_fma(auVar81,auVar103,auVar116);
                            _local_2ce0 = auVar81;
                            uVar66 = (int)lVar64 * 4;
                            fVar1 = *(float *)(local_2ce0 + uVar66);
                            auVar137._4_4_ = fVar1;
                            auVar137._0_4_ = fVar1;
                            auVar137._8_4_ = fVar1;
                            auVar137._12_4_ = fVar1;
                            auVar137._16_4_ = fVar1;
                            auVar137._20_4_ = fVar1;
                            auVar137._24_4_ = fVar1;
                            auVar137._28_4_ = fVar1;
                            auVar83._8_8_ = 0;
                            auVar83._0_8_ = *(ulong *)(lVar65 + 0x50);
                            auVar81 = vpmovzxbd_avx(auVar83);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            uVar76 = *(undefined4 *)(lVar65 + 0x74);
                            auVar144._4_4_ = uVar76;
                            auVar144._0_4_ = uVar76;
                            auVar144._8_4_ = uVar76;
                            auVar144._12_4_ = uVar76;
                            uVar76 = *(undefined4 *)(lVar65 + 0x68);
                            auVar159._4_4_ = uVar76;
                            auVar159._0_4_ = uVar76;
                            auVar159._8_4_ = uVar76;
                            auVar159._12_4_ = uVar76;
                            auVar81 = vfmadd213ps_fma(auVar81,auVar144,auVar159);
                            local_29c0[0] = (RTCHitN)auVar81[0];
                            local_29c0[1] = (RTCHitN)auVar81[1];
                            local_29c0[2] = (RTCHitN)auVar81[2];
                            local_29c0[3] = (RTCHitN)auVar81[3];
                            local_29c0[4] = (RTCHitN)auVar81[4];
                            local_29c0[5] = (RTCHitN)auVar81[5];
                            local_29c0[6] = (RTCHitN)auVar81[6];
                            local_29c0[7] = (RTCHitN)auVar81[7];
                            local_29c0[8] = (RTCHitN)auVar81[8];
                            local_29c0[9] = (RTCHitN)auVar81[9];
                            local_29c0[10] = (RTCHitN)auVar81[10];
                            local_29c0[0xb] = (RTCHitN)auVar81[0xb];
                            local_29c0[0xc] = (RTCHitN)auVar81[0xc];
                            local_29c0[0xd] = (RTCHitN)auVar81[0xd];
                            local_29c0[0xe] = (RTCHitN)auVar81[0xe];
                            local_29c0[0xf] = (RTCHitN)auVar81[0xf];
                            fVar1 = *(float *)(local_29c0 + uVar66) - fVar1;
                            auVar88._4_4_ = fVar1;
                            auVar88._0_4_ = fVar1;
                            auVar88._8_4_ = fVar1;
                            auVar88._12_4_ = fVar1;
                            auVar88._16_4_ = fVar1;
                            auVar88._20_4_ = fVar1;
                            auVar88._24_4_ = fVar1;
                            auVar88._28_4_ = fVar1;
                            auVar134 = in_ZMM13._0_32_;
                            auVar102 = vfmadd213ps_fma(auVar88,auVar134,auVar137);
                            auVar129._8_8_ = 0;
                            auVar129._0_8_ = *(ulong *)(lVar65 + 0x24);
                            auVar81 = vpmovzxbd_avx(auVar129);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            _local_2ce0 = vfmadd213ps_fma(auVar81,auVar103,auVar116);
                            fVar1 = *(float *)(local_2ce0 + uVar66);
                            auVar120._4_4_ = fVar1;
                            auVar120._0_4_ = fVar1;
                            auVar120._8_4_ = fVar1;
                            auVar120._12_4_ = fVar1;
                            auVar120._16_4_ = fVar1;
                            auVar120._20_4_ = fVar1;
                            auVar120._24_4_ = fVar1;
                            auVar120._28_4_ = fVar1;
                            auVar104._8_8_ = 0;
                            auVar104._0_8_ = *(ulong *)(lVar65 + 0x54);
                            auVar81 = vpmovzxbd_avx(auVar104);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            auVar81 = vfmadd213ps_fma(auVar81,auVar144,auVar159);
                            local_29c0[0] = (RTCHitN)auVar81[0];
                            local_29c0[1] = (RTCHitN)auVar81[1];
                            local_29c0[2] = (RTCHitN)auVar81[2];
                            local_29c0[3] = (RTCHitN)auVar81[3];
                            local_29c0[4] = (RTCHitN)auVar81[4];
                            local_29c0[5] = (RTCHitN)auVar81[5];
                            local_29c0[6] = (RTCHitN)auVar81[6];
                            local_29c0[7] = (RTCHitN)auVar81[7];
                            local_29c0[8] = (RTCHitN)auVar81[8];
                            local_29c0[9] = (RTCHitN)auVar81[9];
                            local_29c0[10] = (RTCHitN)auVar81[10];
                            local_29c0[0xb] = (RTCHitN)auVar81[0xb];
                            local_29c0[0xc] = (RTCHitN)auVar81[0xc];
                            local_29c0[0xd] = (RTCHitN)auVar81[0xd];
                            local_29c0[0xe] = (RTCHitN)auVar81[0xe];
                            local_29c0[0xf] = (RTCHitN)auVar81[0xf];
                            fVar1 = *(float *)(local_29c0 + uVar66) - fVar1;
                            auVar108._4_4_ = fVar1;
                            auVar108._0_4_ = fVar1;
                            auVar108._8_4_ = fVar1;
                            auVar108._12_4_ = fVar1;
                            auVar108._16_4_ = fVar1;
                            auVar108._20_4_ = fVar1;
                            auVar108._24_4_ = fVar1;
                            auVar108._28_4_ = fVar1;
                            auVar130._8_8_ = 0;
                            auVar130._0_8_ = *(ulong *)(lVar65 + 0x28);
                            auVar81 = vpmovzxbd_avx(auVar130);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            uVar76 = *(undefined4 *)(lVar65 + 0x48);
                            auVar145._4_4_ = uVar76;
                            auVar145._0_4_ = uVar76;
                            auVar145._8_4_ = uVar76;
                            auVar145._12_4_ = uVar76;
                            uVar76 = *(undefined4 *)(lVar65 + 0x3c);
                            auVar160._4_4_ = uVar76;
                            auVar160._0_4_ = uVar76;
                            auVar160._8_4_ = uVar76;
                            auVar160._12_4_ = uVar76;
                            _local_2ce0 = vfmadd213ps_fma(auVar81,auVar145,auVar160);
                            fVar1 = *(float *)(local_2ce0 + uVar66);
                            auVar138._4_4_ = fVar1;
                            auVar138._0_4_ = fVar1;
                            auVar138._8_4_ = fVar1;
                            auVar138._12_4_ = fVar1;
                            auVar138._16_4_ = fVar1;
                            auVar138._20_4_ = fVar1;
                            auVar138._24_4_ = fVar1;
                            auVar138._28_4_ = fVar1;
                            auVar82 = vfmadd213ps_fma(auVar108,auVar134,auVar120);
                            auVar117._8_8_ = 0;
                            auVar117._0_8_ = *(ulong *)(lVar65 + 0x58);
                            auVar81 = vpmovzxbd_avx(auVar117);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            uVar76 = *(undefined4 *)(lVar65 + 0x78);
                            auVar171._4_4_ = uVar76;
                            auVar171._0_4_ = uVar76;
                            auVar171._8_4_ = uVar76;
                            auVar171._12_4_ = uVar76;
                            uVar76 = *(undefined4 *)(lVar65 + 0x6c);
                            auVar184._4_4_ = uVar76;
                            auVar184._0_4_ = uVar76;
                            auVar184._8_4_ = uVar76;
                            auVar184._12_4_ = uVar76;
                            auVar81 = vfmadd213ps_fma(auVar81,auVar171,auVar184);
                            local_29c0[0] = (RTCHitN)auVar81[0];
                            local_29c0[1] = (RTCHitN)auVar81[1];
                            local_29c0[2] = (RTCHitN)auVar81[2];
                            local_29c0[3] = (RTCHitN)auVar81[3];
                            local_29c0[4] = (RTCHitN)auVar81[4];
                            local_29c0[5] = (RTCHitN)auVar81[5];
                            local_29c0[6] = (RTCHitN)auVar81[6];
                            local_29c0[7] = (RTCHitN)auVar81[7];
                            local_29c0[8] = (RTCHitN)auVar81[8];
                            local_29c0[9] = (RTCHitN)auVar81[9];
                            local_29c0[10] = (RTCHitN)auVar81[10];
                            local_29c0[0xb] = (RTCHitN)auVar81[0xb];
                            local_29c0[0xc] = (RTCHitN)auVar81[0xc];
                            local_29c0[0xd] = (RTCHitN)auVar81[0xd];
                            local_29c0[0xe] = (RTCHitN)auVar81[0xe];
                            local_29c0[0xf] = (RTCHitN)auVar81[0xf];
                            fVar1 = *(float *)(local_29c0 + uVar66) - fVar1;
                            auVar121._4_4_ = fVar1;
                            auVar121._0_4_ = fVar1;
                            auVar121._8_4_ = fVar1;
                            auVar121._12_4_ = fVar1;
                            auVar121._16_4_ = fVar1;
                            auVar121._20_4_ = fVar1;
                            auVar121._24_4_ = fVar1;
                            auVar121._28_4_ = fVar1;
                            auVar83 = vfmadd213ps_fma(auVar121,auVar134,auVar138);
                            auVar131._8_8_ = 0;
                            auVar131._0_8_ = *(ulong *)(lVar65 + 0x2c);
                            auVar81 = vpmovzxbd_avx(auVar131);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            _local_2ce0 = vfmadd213ps_fma(auVar81,auVar145,auVar160);
                            fVar1 = *(float *)(local_2ce0 + uVar66);
                            auVar155._4_4_ = fVar1;
                            auVar155._0_4_ = fVar1;
                            auVar155._8_4_ = fVar1;
                            auVar155._12_4_ = fVar1;
                            auVar155._16_4_ = fVar1;
                            auVar155._20_4_ = fVar1;
                            auVar155._24_4_ = fVar1;
                            auVar155._28_4_ = fVar1;
                            auVar132._8_8_ = 0;
                            auVar132._0_8_ = *(ulong *)(lVar65 + 0x5c);
                            auVar81 = vpmovzxbd_avx(auVar132);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            auVar81 = vfmadd213ps_fma(auVar81,auVar171,auVar184);
                            local_29c0[0] = (RTCHitN)auVar81[0];
                            local_29c0[1] = (RTCHitN)auVar81[1];
                            local_29c0[2] = (RTCHitN)auVar81[2];
                            local_29c0[3] = (RTCHitN)auVar81[3];
                            local_29c0[4] = (RTCHitN)auVar81[4];
                            local_29c0[5] = (RTCHitN)auVar81[5];
                            local_29c0[6] = (RTCHitN)auVar81[6];
                            local_29c0[7] = (RTCHitN)auVar81[7];
                            local_29c0[8] = (RTCHitN)auVar81[8];
                            local_29c0[9] = (RTCHitN)auVar81[9];
                            local_29c0[10] = (RTCHitN)auVar81[10];
                            local_29c0[0xb] = (RTCHitN)auVar81[0xb];
                            local_29c0[0xc] = (RTCHitN)auVar81[0xc];
                            local_29c0[0xd] = (RTCHitN)auVar81[0xd];
                            local_29c0[0xe] = (RTCHitN)auVar81[0xe];
                            local_29c0[0xf] = (RTCHitN)auVar81[0xf];
                            fVar1 = *(float *)(local_29c0 + uVar66) - fVar1;
                            auVar139._4_4_ = fVar1;
                            auVar139._0_4_ = fVar1;
                            auVar139._8_4_ = fVar1;
                            auVar139._12_4_ = fVar1;
                            auVar139._16_4_ = fVar1;
                            auVar139._20_4_ = fVar1;
                            auVar139._24_4_ = fVar1;
                            auVar139._28_4_ = fVar1;
                            auVar161._8_8_ = 0;
                            auVar161._0_8_ = *(ulong *)(lVar65 + 0x30);
                            auVar81 = vpmovzxbd_avx(auVar161);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            uVar76 = *(undefined4 *)(lVar65 + 0x4c);
                            auVar172._4_4_ = uVar76;
                            auVar172._0_4_ = uVar76;
                            auVar172._8_4_ = uVar76;
                            auVar172._12_4_ = uVar76;
                            uVar76 = *(undefined4 *)(lVar65 + 0x40);
                            auVar185._4_4_ = uVar76;
                            auVar185._0_4_ = uVar76;
                            auVar185._8_4_ = uVar76;
                            auVar185._12_4_ = uVar76;
                            _local_2ce0 = vfmadd213ps_fma(auVar81,auVar172,auVar185);
                            fVar1 = *(float *)(local_2ce0 + uVar66);
                            auVar165._4_4_ = fVar1;
                            auVar165._0_4_ = fVar1;
                            auVar165._8_4_ = fVar1;
                            auVar165._12_4_ = fVar1;
                            auVar165._16_4_ = fVar1;
                            auVar165._20_4_ = fVar1;
                            auVar165._24_4_ = fVar1;
                            auVar165._28_4_ = fVar1;
                            auVar103 = vfmadd213ps_fma(auVar139,auVar134,auVar155);
                            auVar146._8_8_ = 0;
                            auVar146._0_8_ = *(ulong *)(lVar65 + 0x60);
                            auVar81 = vpmovzxbd_avx(auVar146);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            uVar76 = *(undefined4 *)(lVar65 + 0x7c);
                            auVar194._4_4_ = uVar76;
                            auVar194._0_4_ = uVar76;
                            auVar194._8_4_ = uVar76;
                            auVar194._12_4_ = uVar76;
                            uVar76 = *(undefined4 *)(lVar65 + 0x70);
                            auVar206._4_4_ = uVar76;
                            auVar206._0_4_ = uVar76;
                            auVar206._8_4_ = uVar76;
                            auVar206._12_4_ = uVar76;
                            auVar81 = vfmadd213ps_fma(auVar81,auVar194,auVar206);
                            local_29c0[0] = (RTCHitN)auVar81[0];
                            local_29c0[1] = (RTCHitN)auVar81[1];
                            local_29c0[2] = (RTCHitN)auVar81[2];
                            local_29c0[3] = (RTCHitN)auVar81[3];
                            local_29c0[4] = (RTCHitN)auVar81[4];
                            local_29c0[5] = (RTCHitN)auVar81[5];
                            local_29c0[6] = (RTCHitN)auVar81[6];
                            local_29c0[7] = (RTCHitN)auVar81[7];
                            local_29c0[8] = (RTCHitN)auVar81[8];
                            local_29c0[9] = (RTCHitN)auVar81[9];
                            local_29c0[10] = (RTCHitN)auVar81[10];
                            local_29c0[0xb] = (RTCHitN)auVar81[0xb];
                            local_29c0[0xc] = (RTCHitN)auVar81[0xc];
                            local_29c0[0xd] = (RTCHitN)auVar81[0xd];
                            local_29c0[0xe] = (RTCHitN)auVar81[0xe];
                            local_29c0[0xf] = (RTCHitN)auVar81[0xf];
                            fVar1 = *(float *)(local_29c0 + uVar66) - fVar1;
                            auVar156._4_4_ = fVar1;
                            auVar156._0_4_ = fVar1;
                            auVar156._8_4_ = fVar1;
                            auVar156._12_4_ = fVar1;
                            auVar156._16_4_ = fVar1;
                            auVar156._20_4_ = fVar1;
                            auVar156._24_4_ = fVar1;
                            auVar156._28_4_ = fVar1;
                            auVar104 = vfmadd213ps_fma(auVar156,auVar134,auVar165);
                            auVar162._8_8_ = 0;
                            auVar162._0_8_ = *(ulong *)(lVar65 + 0x34);
                            auVar81 = vpmovzxbd_avx(auVar162);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            _local_2ce0 = vfmadd213ps_fma(auVar81,auVar172,auVar185);
                            fVar1 = *(float *)(local_2ce0 + uVar66);
                            auVar166._4_4_ = fVar1;
                            auVar166._0_4_ = fVar1;
                            auVar166._8_4_ = fVar1;
                            auVar166._12_4_ = fVar1;
                            auVar166._16_4_ = fVar1;
                            auVar166._20_4_ = fVar1;
                            auVar166._24_4_ = fVar1;
                            auVar166._28_4_ = fVar1;
                            auVar173._8_8_ = 0;
                            auVar173._0_8_ = *(ulong *)(lVar65 + 100);
                            auVar81 = vpmovzxbd_avx(auVar173);
                            auVar81 = vcvtdq2ps_avx(auVar81);
                            auVar81 = vfmadd213ps_fma(auVar81,auVar194,auVar206);
                            local_29c0[0] = (RTCHitN)auVar81[0];
                            local_29c0[1] = (RTCHitN)auVar81[1];
                            local_29c0[2] = (RTCHitN)auVar81[2];
                            local_29c0[3] = (RTCHitN)auVar81[3];
                            local_29c0[4] = (RTCHitN)auVar81[4];
                            local_29c0[5] = (RTCHitN)auVar81[5];
                            local_29c0[6] = (RTCHitN)auVar81[6];
                            local_29c0[7] = (RTCHitN)auVar81[7];
                            local_29c0[8] = (RTCHitN)auVar81[8];
                            local_29c0[9] = (RTCHitN)auVar81[9];
                            local_29c0[10] = (RTCHitN)auVar81[10];
                            local_29c0[0xb] = (RTCHitN)auVar81[0xb];
                            local_29c0[0xc] = (RTCHitN)auVar81[0xc];
                            local_29c0[0xd] = (RTCHitN)auVar81[0xd];
                            local_29c0[0xe] = (RTCHitN)auVar81[0xe];
                            local_29c0[0xf] = (RTCHitN)auVar81[0xf];
                            fVar1 = *(float *)(local_29c0 + uVar66) - fVar1;
                            auVar178._4_4_ = fVar1;
                            auVar178._0_4_ = fVar1;
                            auVar178._8_4_ = fVar1;
                            auVar178._12_4_ = fVar1;
                            auVar178._16_4_ = fVar1;
                            auVar178._20_4_ = fVar1;
                            auVar178._24_4_ = fVar1;
                            auVar178._28_4_ = fVar1;
                            auVar81 = vfmadd213ps_fma(auVar178,auVar134,auVar166);
                            auVar56._8_8_ = local_2b80._8_8_;
                            auVar56._0_8_ = local_2b80._0_8_;
                            auVar56._16_8_ = local_2b80._16_8_;
                            auVar56._24_8_ = local_2b80._24_8_;
                            auVar58._8_8_ = local_2b80._40_8_;
                            auVar58._0_8_ = local_2b80._32_8_;
                            auVar58._16_8_ = local_2b80._48_8_;
                            auVar58._24_8_ = local_2b80._56_8_;
                            auVar60._8_8_ = local_2b80._72_8_;
                            auVar60._0_8_ = local_2b80._64_8_;
                            auVar60._16_8_ = local_2b80._80_8_;
                            auVar60._24_8_ = local_2b80._88_8_;
                            auVar134 = vsubps_avx(ZEXT1632(auVar102),auVar56);
                            auVar28._4_4_ = local_2ac0._4_4_ * auVar134._4_4_;
                            auVar28._0_4_ = local_2ac0._0_4_ * auVar134._0_4_;
                            auVar28._8_4_ = local_2ac0._8_4_ * auVar134._8_4_;
                            auVar28._12_4_ = local_2ac0._12_4_ * auVar134._12_4_;
                            auVar28._16_4_ = local_2ac0._16_4_ * auVar134._16_4_;
                            auVar28._20_4_ = local_2ac0._20_4_ * auVar134._20_4_;
                            auVar28._24_4_ = local_2ac0._24_4_ * auVar134._24_4_;
                            auVar28._28_4_ = auVar134._28_4_;
                            auVar134 = vsubps_avx(ZEXT1632(auVar83),auVar58);
                            auVar29._4_4_ = (float)local_2aa0._4_4_ * auVar134._4_4_;
                            auVar29._0_4_ = (float)local_2aa0._0_4_ * auVar134._0_4_;
                            auVar29._8_4_ = fStack_2a98 * auVar134._8_4_;
                            auVar29._12_4_ = fStack_2a94 * auVar134._12_4_;
                            auVar29._16_4_ = fStack_2a90 * auVar134._16_4_;
                            auVar29._20_4_ = fStack_2a8c * auVar134._20_4_;
                            auVar29._24_4_ = fStack_2a88 * auVar134._24_4_;
                            auVar29._28_4_ = auVar134._28_4_;
                            auVar134 = vsubps_avx(ZEXT1632(auVar104),auVar60);
                            auVar30._4_4_ = (float)local_2a80._4_4_ * auVar134._4_4_;
                            auVar30._0_4_ = (float)local_2a80._0_4_ * auVar134._0_4_;
                            auVar30._8_4_ = fStack_2a78 * auVar134._8_4_;
                            auVar30._12_4_ = fStack_2a74 * auVar134._12_4_;
                            auVar30._16_4_ = fStack_2a70 * auVar134._16_4_;
                            auVar30._20_4_ = fStack_2a6c * auVar134._20_4_;
                            auVar30._24_4_ = fStack_2a68 * auVar134._24_4_;
                            auVar30._28_4_ = auVar134._28_4_;
                            auVar134 = vsubps_avx(ZEXT1632(auVar82),auVar56);
                            auVar31._4_4_ = local_2ac0._4_4_ * auVar134._4_4_;
                            auVar31._0_4_ = local_2ac0._0_4_ * auVar134._0_4_;
                            auVar31._8_4_ = local_2ac0._8_4_ * auVar134._8_4_;
                            auVar31._12_4_ = local_2ac0._12_4_ * auVar134._12_4_;
                            auVar31._16_4_ = local_2ac0._16_4_ * auVar134._16_4_;
                            auVar31._20_4_ = local_2ac0._20_4_ * auVar134._20_4_;
                            auVar31._24_4_ = local_2ac0._24_4_ * auVar134._24_4_;
                            auVar31._28_4_ = auVar134._28_4_;
                            auVar134 = vsubps_avx(ZEXT1632(auVar103),auVar58);
                            auVar32._4_4_ = (float)local_2aa0._4_4_ * auVar134._4_4_;
                            auVar32._0_4_ = (float)local_2aa0._0_4_ * auVar134._0_4_;
                            auVar32._8_4_ = fStack_2a98 * auVar134._8_4_;
                            auVar32._12_4_ = fStack_2a94 * auVar134._12_4_;
                            auVar32._16_4_ = fStack_2a90 * auVar134._16_4_;
                            auVar32._20_4_ = fStack_2a8c * auVar134._20_4_;
                            auVar32._24_4_ = fStack_2a88 * auVar134._24_4_;
                            auVar32._28_4_ = auVar134._28_4_;
                            auVar134 = vsubps_avx(ZEXT1632(auVar81),auVar60);
                            auVar33._4_4_ = (float)local_2a80._4_4_ * auVar134._4_4_;
                            auVar33._0_4_ = (float)local_2a80._0_4_ * auVar134._0_4_;
                            auVar33._8_4_ = fStack_2a78 * auVar134._8_4_;
                            auVar33._12_4_ = fStack_2a74 * auVar134._12_4_;
                            auVar33._16_4_ = fStack_2a70 * auVar134._16_4_;
                            auVar33._20_4_ = fStack_2a6c * auVar134._20_4_;
                            auVar33._24_4_ = fStack_2a68 * auVar134._24_4_;
                            auVar33._28_4_ = auVar134._28_4_;
                            auVar134 = vminps_avx(auVar28,auVar31);
                            auVar107 = vminps_avx(auVar29,auVar32);
                            auVar134 = vmaxps_avx(auVar134,auVar107);
                            auVar107 = vminps_avx(auVar30,auVar33);
                            auVar134 = vmaxps_avx(auVar134,auVar107);
                            auVar34._4_4_ = auVar134._4_4_ * 0.99999964;
                            auVar34._0_4_ = auVar134._0_4_ * 0.99999964;
                            auVar34._8_4_ = auVar134._8_4_ * 0.99999964;
                            auVar34._12_4_ = auVar134._12_4_ * 0.99999964;
                            auVar34._16_4_ = auVar134._16_4_ * 0.99999964;
                            auVar34._20_4_ = auVar134._20_4_ * 0.99999964;
                            auVar34._24_4_ = auVar134._24_4_ * 0.99999964;
                            auVar34._28_4_ = auVar134._28_4_;
                            auVar134 = vmaxps_avx(auVar28,auVar31);
                            auVar107 = vmaxps_avx(auVar29,auVar32);
                            auVar107 = vminps_avx(auVar134,auVar107);
                            auVar134 = vmaxps_avx(auVar30,auVar33);
                            auVar134 = vminps_avx(auVar107,auVar134);
                            auVar35._4_4_ = auVar134._4_4_ * 1.0000004;
                            auVar35._0_4_ = auVar134._0_4_ * 1.0000004;
                            auVar35._8_4_ = auVar134._8_4_ * 1.0000004;
                            auVar35._12_4_ = auVar134._12_4_ * 1.0000004;
                            auVar35._16_4_ = auVar134._16_4_ * 1.0000004;
                            auVar35._20_4_ = auVar134._20_4_ * 1.0000004;
                            auVar35._24_4_ = auVar134._24_4_ * 1.0000004;
                            auVar35._28_4_ = auVar134._28_4_;
                            auVar134 = vmaxps_avx(auVar34,local_2a00);
                            auVar107 = vminps_avx(auVar35,local_29e0);
                            auVar107 = vcmpps_avx(auVar134,auVar107,2);
                            auVar85 = auVar115._0_32_;
                            auVar107 = auVar85 & auVar107;
                            if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar107 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar107 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar107 >> 0x7f,0) == '\0') &&
                                  (auVar107 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar107 >> 0xbf,0) == '\0') &&
                                (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar107[0x1f]) {
                              bVar79 = false;
                            }
                            else {
                              uVar3 = *(ushort *)(lVar65 + lVar64 * 8);
                              uVar4 = *(ushort *)(lVar65 + 2 + lVar64 * 8);
                              local_2f14 = (uint)uVar4;
                              uVar66 = *(uint *)(lVar65 + 0x88);
                              unaff_R14 = (ulong)uVar66;
                              uVar5 = *(uint *)(lVar65 + 4 + lVar64 * 8);
                              local_2ee8 = (ulong)uVar5;
                              local_2820 = auVar85;
                              uVar61 = vmovmskps_avx(auVar85);
                              local_2e08 = uVar73;
                              local_2d00 = auVar85;
                              if (uVar61 != 0) {
                                uVar75 = (ulong)(uVar61 & 0xff);
                                local_2ef4 = uVar3 & 0x7fff;
                                local_2ef8 = local_2f14 & 0x7fff;
                                local_2df0 = (ulong)(-1 < (short)uVar3);
                                auVar89._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                                auVar89._8_4_ = local_2ef4;
                                auVar89._12_4_ = local_2ef4;
                                auVar89._16_4_ = local_2ef4;
                                auVar89._20_4_ = local_2ef4;
                                auVar89._24_4_ = local_2ef4;
                                auVar89._28_4_ = local_2ef4;
                                auVar134 = vpaddd_avx2(auVar89,_DAT_0205d4c0);
                                auVar109._0_8_ = (ulong)CONCAT24(uVar4,local_2f14) & 0x7fff00007fff;
                                auVar109._8_4_ = local_2ef8;
                                auVar109._12_4_ = local_2ef8;
                                auVar109._16_4_ = local_2ef8;
                                auVar109._20_4_ = local_2ef8;
                                auVar109._24_4_ = local_2ef8;
                                auVar109._28_4_ = local_2ef8;
                                auVar107 = vpaddd_avx2(auVar109,_DAT_0205d4e0);
                                _local_2780 = vcvtdq2ps_avx(auVar134);
                                _local_27a0 = vcvtdq2ps_avx(auVar107);
                                local_2860 = uVar66;
                                uStack_285c = uVar66;
                                uStack_2858 = uVar66;
                                uStack_2854 = uVar66;
                                uStack_2850 = uVar66;
                                uStack_284c = uVar66;
                                uStack_2848 = uVar66;
                                uStack_2844 = uVar66;
                                local_2880 = uVar5;
                                uStack_287c = uVar5;
                                uStack_2878 = uVar5;
                                uStack_2874 = uVar5;
                                uStack_2870 = uVar5;
                                uStack_286c = uVar5;
                                uStack_2868 = uVar5;
                                uStack_2864 = uVar5;
                                pRVar74 = ray;
                                uVar68 = unaff_R14;
                                pRVar78 = context;
                                local_2de8 = unaff_R14;
                                do {
                                  unaff_R14 = local_2de8;
                                  context = local_2df8;
                                  ray = local_2e00;
                                  local_2d60._0_8_ = uVar75;
                                  lVar65 = 0;
                                  for (; (uVar75 & 1) == 0;
                                      uVar75 = uVar75 >> 1 | 0x8000000000000000) {
                                    lVar65 = lVar65 + 1;
                                  }
                                  local_2dd0 = pRVar78->scene;
                                  pGVar7 = (local_2dd0->geometries).items[uVar68].ptr;
                                  local_2dd8 = *(long *)&pGVar7->field_0x58;
                                  local_2de0 = pGVar7[1].super_RefCount.refCounter.
                                               super___atomic_base<unsigned_long>._M_i * local_2ee8;
                                  fVar1 = (pGVar7->time_range).lower;
                                  auVar90._4_4_ = fVar1;
                                  auVar90._0_4_ = fVar1;
                                  auVar90._8_4_ = fVar1;
                                  auVar90._12_4_ = fVar1;
                                  auVar90._16_4_ = fVar1;
                                  auVar90._20_4_ = fVar1;
                                  auVar90._24_4_ = fVar1;
                                  auVar90._28_4_ = fVar1;
                                  fVar2 = pGVar7->fnumTimeSegments;
                                  auVar134 = vsubps_avx(*(undefined1 (*) [32])(pRVar74 + 0xe0),
                                                        auVar90);
                                  fVar1 = (pGVar7->time_range).upper - fVar1;
                                  auVar91._4_4_ = fVar1;
                                  auVar91._0_4_ = fVar1;
                                  auVar91._8_4_ = fVar1;
                                  auVar91._12_4_ = fVar1;
                                  auVar91._16_4_ = fVar1;
                                  auVar91._20_4_ = fVar1;
                                  auVar91._24_4_ = fVar1;
                                  auVar91._28_4_ = fVar1;
                                  auVar134 = vdivps_avx(auVar134,auVar91);
                                  auVar36._4_4_ = fVar2 * auVar134._4_4_;
                                  auVar36._0_4_ = fVar2 * auVar134._0_4_;
                                  auVar36._8_4_ = fVar2 * auVar134._8_4_;
                                  auVar36._12_4_ = fVar2 * auVar134._12_4_;
                                  auVar36._16_4_ = fVar2 * auVar134._16_4_;
                                  auVar36._20_4_ = fVar2 * auVar134._20_4_;
                                  auVar36._24_4_ = fVar2 * auVar134._24_4_;
                                  auVar36._28_4_ = auVar134._28_4_;
                                  auVar134 = vroundps_avx(auVar36,1);
                                  fVar2 = fVar2 + -1.0;
                                  auVar110._4_4_ = fVar2;
                                  auVar110._0_4_ = fVar2;
                                  auVar110._8_4_ = fVar2;
                                  auVar110._12_4_ = fVar2;
                                  auVar110._16_4_ = fVar2;
                                  auVar110._20_4_ = fVar2;
                                  auVar110._24_4_ = fVar2;
                                  auVar110._28_4_ = fVar2;
                                  auVar134 = vminps_avx(auVar134,auVar110);
                                  auVar134 = vmaxps_avx(auVar134,_DAT_02020f00);
                                  local_2640 = vsubps_avx(auVar36,auVar134);
                                  local_2660 = vcvtps2dq_avx(auVar134);
                                  uVar68 = (ulong)((uint)lVar65 * 4);
                                  uVar66 = *(uint *)(local_2dd8 + 4 + local_2de0);
                                  uVar73 = (ulong)uVar66;
                                  uVar63 = (ulong)(uVar66 * local_2ef8 +
                                                  *(int *)(local_2dd8 + local_2de0) + local_2ef4);
                                  lVar8 = *(long *)&pGVar7[2].numPrimitives;
                                  lVar69 = (long)*(int *)(local_2660 + uVar68) * 0x38;
                                  lVar9 = *(long *)(lVar8 + lVar69);
                                  lVar10 = *(long *)(lVar8 + 0x10 + lVar69);
                                  auVar81 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar63);
                                  lVar11 = *(long *)(lVar8 + 0x48 + lVar69);
                                  auVar102 = *(undefined1 (*) [16])(lVar9 + (uVar63 + 1) * lVar10);
                                  lVar64 = uVar63 + uVar73;
                                  auVar82 = *(undefined1 (*) [16])(lVar9 + lVar64 * lVar10);
                                  lVar77 = uVar63 + uVar73 + 1;
                                  auVar103 = *(undefined1 (*) [16])(lVar9 + lVar77 * lVar10);
                                  lVar67 = uVar63 + local_2df0 + 1;
                                  auVar83 = *(undefined1 (*) [16])(lVar9 + lVar67 * lVar10);
                                  lVar70 = local_2df0 + lVar77;
                                  auVar104 = *(undefined1 (*) [16])(lVar9 + lVar70 * lVar10);
                                  uVar75 = 0;
                                  if (-1 < (short)local_2f14) {
                                    uVar75 = uVar73;
                                  }
                                  auVar116 = *(undefined1 (*) [16])
                                              (lVar9 + (lVar64 + uVar75) * lVar10);
                                  auVar117 = *(undefined1 (*) [16])
                                              (lVar9 + (lVar77 + uVar75) * lVar10);
                                  auVar129 = *(undefined1 (*) [16])
                                              (lVar9 + lVar10 * (uVar75 + lVar70));
                                  lVar8 = *(long *)(lVar8 + 0x38 + lVar69);
                                  uVar76 = *(undefined4 *)(local_2640 + uVar68);
                                  auVar225._4_4_ = uVar76;
                                  auVar225._0_4_ = uVar76;
                                  auVar225._8_4_ = uVar76;
                                  auVar225._12_4_ = uVar76;
                                  auVar130 = vsubps_avx(*(undefined1 (*) [16])
                                                         (lVar8 + lVar11 * uVar63),auVar81);
                                  auVar130 = vfmadd213ps_fma(auVar130,auVar225,auVar81);
                                  auVar81 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar8 + lVar11 * (uVar63 + 1)),auVar102);
                                  auVar131 = vfmadd213ps_fma(auVar81,auVar225,auVar102);
                                  auVar81 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar8 + lVar11 * lVar64),auVar82);
                                  auVar132 = vfmadd213ps_fma(auVar81,auVar225,auVar82);
                                  auVar81 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar8 + lVar11 * lVar77),auVar103);
                                  auVar144 = vfmadd213ps_fma(auVar81,auVar225,auVar103);
                                  auVar81 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar8 + lVar11 * lVar67),auVar83);
                                  auVar102 = vfmadd213ps_fma(auVar81,auVar225,auVar83);
                                  auVar81 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar8 + lVar11 * lVar70),auVar104);
                                  auVar145 = vfmadd213ps_fma(auVar81,auVar225,auVar104);
                                  auVar81 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar8 + lVar11 * (lVar64 + uVar75)),
                                                       auVar116);
                                  auVar146 = vfmadd213ps_fma(auVar81,auVar225,auVar116);
                                  auVar81 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar8 + lVar11 * (lVar77 + uVar75)),
                                                       auVar117);
                                  auVar159 = vfmadd213ps_fma(auVar81,auVar225,auVar117);
                                  auVar81 = vsubps_avx(*(undefined1 (*) [16])
                                                        (lVar8 + (uVar75 + lVar70) * lVar11),
                                                       auVar129);
                                  auVar129 = vfmadd213ps_fma(auVar81,auVar225,auVar129);
                                  auVar82 = vunpcklps_avx(auVar131,auVar145);
                                  auVar81 = vunpckhps_avx(auVar131,auVar145);
                                  auVar83 = vunpcklps_avx(auVar102,auVar144);
                                  auVar102 = vunpckhps_avx(auVar102,auVar144);
                                  auVar103 = vunpcklps_avx(auVar81,auVar102);
                                  auVar104 = vunpcklps_avx(auVar82,auVar83);
                                  auVar81 = vunpckhps_avx(auVar82,auVar83);
                                  auVar83 = vunpcklps_avx(auVar132,auVar159);
                                  auVar102 = vunpckhps_avx(auVar132,auVar159);
                                  auVar116 = vunpcklps_avx(auVar144,auVar146);
                                  auVar82 = vunpckhps_avx(auVar144,auVar146);
                                  auVar82 = vunpcklps_avx(auVar102,auVar82);
                                  auVar117 = vunpcklps_avx(auVar83,auVar116);
                                  auVar102 = vunpckhps_avx(auVar83,auVar116);
                                  auVar167._16_16_ = auVar159;
                                  auVar167._0_16_ = auVar132;
                                  auVar92._16_16_ = auVar145;
                                  auVar92._0_16_ = auVar131;
                                  auVar134 = vunpcklps_avx(auVar92,auVar167);
                                  auVar188._16_16_ = auVar144;
                                  auVar188._0_16_ = auVar130;
                                  auVar111._16_16_ = auVar129;
                                  auVar111._0_16_ = auVar144;
                                  auVar107 = vunpcklps_avx(auVar188,auVar111);
                                  auVar133 = vunpcklps_avx(auVar107,auVar134);
                                  auVar134 = vunpckhps_avx(auVar107,auVar134);
                                  auVar107 = vunpckhps_avx(auVar92,auVar167);
                                  auVar85 = vunpckhps_avx(auVar188,auVar111);
                                  auVar107 = vunpcklps_avx(auVar85,auVar107);
                                  auVar216._16_16_ = auVar104;
                                  auVar216._0_16_ = auVar104;
                                  auVar168._16_16_ = auVar81;
                                  auVar168._0_16_ = auVar81;
                                  auVar179._16_16_ = auVar103;
                                  auVar179._0_16_ = auVar103;
                                  auVar140._16_16_ = auVar117;
                                  auVar140._0_16_ = auVar117;
                                  auVar189._16_16_ = auVar102;
                                  auVar189._0_16_ = auVar102;
                                  local_2c80 = &local_2f16;
                                  uVar76 = *(undefined4 *)(local_2e00 + uVar68);
                                  auVar196._4_4_ = uVar76;
                                  auVar196._0_4_ = uVar76;
                                  auVar196._8_4_ = uVar76;
                                  auVar196._12_4_ = uVar76;
                                  auVar196._16_4_ = uVar76;
                                  auVar196._20_4_ = uVar76;
                                  auVar196._24_4_ = uVar76;
                                  auVar196._28_4_ = uVar76;
                                  uVar76 = *(undefined4 *)(local_2e00 + uVar68 + 0x20);
                                  auVar209._4_4_ = uVar76;
                                  auVar209._0_4_ = uVar76;
                                  auVar209._8_4_ = uVar76;
                                  auVar209._12_4_ = uVar76;
                                  auVar209._16_4_ = uVar76;
                                  auVar209._20_4_ = uVar76;
                                  auVar209._24_4_ = uVar76;
                                  auVar209._28_4_ = uVar76;
                                  uVar76 = *(undefined4 *)(local_2e00 + uVar68 + 0x40);
                                  auVar214._4_4_ = uVar76;
                                  auVar214._0_4_ = uVar76;
                                  auVar214._8_4_ = uVar76;
                                  auVar214._12_4_ = uVar76;
                                  auVar214._16_4_ = uVar76;
                                  auVar214._20_4_ = uVar76;
                                  auVar214._24_4_ = uVar76;
                                  auVar214._28_4_ = uVar76;
                                  auVar122._16_16_ = auVar82;
                                  auVar122._0_16_ = auVar82;
                                  local_2ea0 = vsubps_avx(auVar133,auVar196);
                                  local_2680 = vsubps_avx(auVar134,auVar209);
                                  local_26a0 = vsubps_avx(auVar107,auVar214);
                                  auVar134 = vsubps_avx(auVar216,auVar196);
                                  auVar107 = vsubps_avx(auVar168,auVar209);
                                  auVar133 = vsubps_avx(auVar179,auVar214);
                                  auVar85 = vsubps_avx(auVar140,auVar196);
                                  auVar106 = vsubps_avx(auVar189,auVar209);
                                  auVar148 = vsubps_avx(auVar122,auVar214);
                                  local_26c0 = vsubps_avx(auVar85,local_2ea0);
                                  local_2700 = vsubps_avx(auVar106,local_2680);
                                  local_26e0 = vsubps_avx(auVar148,local_26a0);
                                  auVar123._0_4_ = local_2ea0._0_4_ + auVar85._0_4_;
                                  auVar123._4_4_ = local_2ea0._4_4_ + auVar85._4_4_;
                                  auVar123._8_4_ = local_2ea0._8_4_ + auVar85._8_4_;
                                  auVar123._12_4_ = local_2ea0._12_4_ + auVar85._12_4_;
                                  auVar123._16_4_ = local_2ea0._16_4_ + auVar85._16_4_;
                                  auVar123._20_4_ = local_2ea0._20_4_ + auVar85._20_4_;
                                  auVar123._24_4_ = local_2ea0._24_4_ + auVar85._24_4_;
                                  auVar123._28_4_ = local_2ea0._28_4_ + auVar85._28_4_;
                                  auVar169._0_4_ = local_2680._0_4_ + auVar106._0_4_;
                                  auVar169._4_4_ = local_2680._4_4_ + auVar106._4_4_;
                                  auVar169._8_4_ = local_2680._8_4_ + auVar106._8_4_;
                                  auVar169._12_4_ = local_2680._12_4_ + auVar106._12_4_;
                                  auVar169._16_4_ = local_2680._16_4_ + auVar106._16_4_;
                                  auVar169._20_4_ = local_2680._20_4_ + auVar106._20_4_;
                                  auVar169._24_4_ = local_2680._24_4_ + auVar106._24_4_;
                                  auVar169._28_4_ = local_2680._28_4_ + auVar106._28_4_;
                                  fVar1 = local_26a0._0_4_;
                                  auVar180._0_4_ = auVar148._0_4_ + fVar1;
                                  fVar2 = local_26a0._4_4_;
                                  auVar180._4_4_ = auVar148._4_4_ + fVar2;
                                  fVar13 = local_26a0._8_4_;
                                  auVar180._8_4_ = auVar148._8_4_ + fVar13;
                                  fVar14 = local_26a0._12_4_;
                                  auVar180._12_4_ = auVar148._12_4_ + fVar14;
                                  fVar15 = local_26a0._16_4_;
                                  auVar180._16_4_ = auVar148._16_4_ + fVar15;
                                  fVar16 = local_26a0._20_4_;
                                  auVar180._20_4_ = auVar148._20_4_ + fVar16;
                                  fVar17 = local_26a0._24_4_;
                                  auVar180._24_4_ = auVar148._24_4_ + fVar17;
                                  auVar180._28_4_ = auVar148._28_4_ + local_26a0._28_4_;
                                  auVar37._4_4_ = local_26e0._4_4_ * auVar169._4_4_;
                                  auVar37._0_4_ = local_26e0._0_4_ * auVar169._0_4_;
                                  auVar37._8_4_ = local_26e0._8_4_ * auVar169._8_4_;
                                  auVar37._12_4_ = local_26e0._12_4_ * auVar169._12_4_;
                                  auVar37._16_4_ = local_26e0._16_4_ * auVar169._16_4_;
                                  auVar37._20_4_ = local_26e0._20_4_ * auVar169._20_4_;
                                  auVar37._24_4_ = local_26e0._24_4_ * auVar169._24_4_;
                                  auVar37._28_4_ = auVar104._12_4_;
                                  auVar102 = vfmsub231ps_fma(auVar37,local_2700,auVar180);
                                  auVar38._4_4_ = local_26c0._4_4_ * auVar180._4_4_;
                                  auVar38._0_4_ = local_26c0._0_4_ * auVar180._0_4_;
                                  auVar38._8_4_ = local_26c0._8_4_ * auVar180._8_4_;
                                  auVar38._12_4_ = local_26c0._12_4_ * auVar180._12_4_;
                                  auVar38._16_4_ = local_26c0._16_4_ * auVar180._16_4_;
                                  auVar38._20_4_ = local_26c0._20_4_ * auVar180._20_4_;
                                  auVar38._24_4_ = local_26c0._24_4_ * auVar180._24_4_;
                                  auVar38._28_4_ = auVar180._28_4_;
                                  auVar81 = vfmsub231ps_fma(auVar38,local_26e0,auVar123);
                                  auVar39._4_4_ = local_2700._4_4_ * auVar123._4_4_;
                                  auVar39._0_4_ = local_2700._0_4_ * auVar123._0_4_;
                                  auVar39._8_4_ = local_2700._8_4_ * auVar123._8_4_;
                                  auVar39._12_4_ = local_2700._12_4_ * auVar123._12_4_;
                                  auVar39._16_4_ = local_2700._16_4_ * auVar123._16_4_;
                                  auVar39._20_4_ = local_2700._20_4_ * auVar123._20_4_;
                                  auVar39._24_4_ = local_2700._24_4_ * auVar123._24_4_;
                                  auVar39._28_4_ = auVar123._28_4_;
                                  auVar82 = vfmsub231ps_fma(auVar39,local_26c0,auVar169);
                                  local_2ee0._4_4_ = *(undefined4 *)(local_2e00 + uVar68 + 0xc0);
                                  auVar226._0_4_ = (float)local_2ee0._4_4_ * auVar82._0_4_;
                                  auVar226._4_4_ = (float)local_2ee0._4_4_ * auVar82._4_4_;
                                  auVar226._8_4_ = (float)local_2ee0._4_4_ * auVar82._8_4_;
                                  auVar226._12_4_ = (float)local_2ee0._4_4_ * auVar82._12_4_;
                                  auVar226._16_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar226._20_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar226._24_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar226._28_4_ = 0;
                                  uVar76 = *(undefined4 *)(local_2e00 + uVar68 + 0xa0);
                                  local_2ec0._4_4_ = uVar76;
                                  local_2ec0._0_4_ = uVar76;
                                  local_2ec0._8_4_ = uVar76;
                                  local_2ec0._12_4_ = uVar76;
                                  local_2ec0._16_4_ = uVar76;
                                  local_2ec0._20_4_ = uVar76;
                                  local_2ec0._24_4_ = uVar76;
                                  local_2ec0._28_4_ = uVar76;
                                  auVar81 = vfmadd231ps_fma(auVar226,local_2ec0,ZEXT1632(auVar81));
                                  uVar76 = *(undefined4 *)(local_2e00 + uVar68 + 0x80);
                                  local_2e80._4_4_ = uVar76;
                                  local_2e80._0_4_ = uVar76;
                                  local_2e80._8_4_ = uVar76;
                                  local_2e80._12_4_ = uVar76;
                                  local_2e80._16_4_ = uVar76;
                                  local_2e80._20_4_ = uVar76;
                                  local_2e80._24_4_ = uVar76;
                                  local_2e80._28_4_ = uVar76;
                                  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_2e80,
                                                            ZEXT1632(auVar102));
                                  local_2720 = vsubps_avx(local_2680,auVar107);
                                  local_2740 = vsubps_avx(local_26a0,auVar133);
                                  auVar170._0_4_ = local_2680._0_4_ + auVar107._0_4_;
                                  auVar170._4_4_ = local_2680._4_4_ + auVar107._4_4_;
                                  auVar170._8_4_ = local_2680._8_4_ + auVar107._8_4_;
                                  auVar170._12_4_ = local_2680._12_4_ + auVar107._12_4_;
                                  auVar170._16_4_ = local_2680._16_4_ + auVar107._16_4_;
                                  auVar170._20_4_ = local_2680._20_4_ + auVar107._20_4_;
                                  auVar170._24_4_ = local_2680._24_4_ + auVar107._24_4_;
                                  auVar170._28_4_ = local_2680._28_4_ + auVar107._28_4_;
                                  auVar181._0_4_ = auVar133._0_4_ + fVar1;
                                  auVar181._4_4_ = auVar133._4_4_ + fVar2;
                                  auVar181._8_4_ = auVar133._8_4_ + fVar13;
                                  auVar181._12_4_ = auVar133._12_4_ + fVar14;
                                  auVar181._16_4_ = auVar133._16_4_ + fVar15;
                                  auVar181._20_4_ = auVar133._20_4_ + fVar16;
                                  auVar181._24_4_ = auVar133._24_4_ + fVar17;
                                  fVar193 = auVar133._28_4_;
                                  auVar181._28_4_ = fVar193 + local_26a0._28_4_;
                                  fVar80 = local_2740._0_4_;
                                  fVar97 = local_2740._4_4_;
                                  auVar40._4_4_ = auVar170._4_4_ * fVar97;
                                  auVar40._0_4_ = auVar170._0_4_ * fVar80;
                                  fVar99 = local_2740._8_4_;
                                  auVar40._8_4_ = auVar170._8_4_ * fVar99;
                                  fVar101 = local_2740._12_4_;
                                  auVar40._12_4_ = auVar170._12_4_ * fVar101;
                                  fVar19 = local_2740._16_4_;
                                  auVar40._16_4_ = auVar170._16_4_ * fVar19;
                                  fVar21 = local_2740._20_4_;
                                  auVar40._20_4_ = auVar170._20_4_ * fVar21;
                                  fVar23 = local_2740._24_4_;
                                  auVar40._24_4_ = auVar170._24_4_ * fVar23;
                                  auVar40._28_4_ = fVar193;
                                  auVar82 = vfmsub231ps_fma(auVar40,local_2720,auVar181);
                                  in_ZMM14 = ZEXT3264(auVar134);
                                  local_2760 = vsubps_avx(local_2ea0,auVar134);
                                  fVar96 = local_2760._0_4_;
                                  fVar98 = local_2760._4_4_;
                                  auVar41._4_4_ = auVar181._4_4_ * fVar98;
                                  auVar41._0_4_ = auVar181._0_4_ * fVar96;
                                  fVar100 = local_2760._8_4_;
                                  auVar41._8_4_ = auVar181._8_4_ * fVar100;
                                  fVar18 = local_2760._12_4_;
                                  auVar41._12_4_ = auVar181._12_4_ * fVar18;
                                  fVar20 = local_2760._16_4_;
                                  auVar41._16_4_ = auVar181._16_4_ * fVar20;
                                  fVar22 = local_2760._20_4_;
                                  auVar41._20_4_ = auVar181._20_4_ * fVar22;
                                  fVar24 = local_2760._24_4_;
                                  auVar41._24_4_ = auVar181._24_4_ * fVar24;
                                  auVar41._28_4_ = local_26e0._28_4_;
                                  auVar182._0_4_ = local_2ea0._0_4_ + auVar134._0_4_;
                                  auVar182._4_4_ = local_2ea0._4_4_ + auVar134._4_4_;
                                  auVar182._8_4_ = local_2ea0._8_4_ + auVar134._8_4_;
                                  auVar182._12_4_ = local_2ea0._12_4_ + auVar134._12_4_;
                                  auVar182._16_4_ = local_2ea0._16_4_ + auVar134._16_4_;
                                  auVar182._20_4_ = local_2ea0._20_4_ + auVar134._20_4_;
                                  auVar182._24_4_ = local_2ea0._24_4_ + auVar134._24_4_;
                                  auVar182._28_4_ = local_2ea0._28_4_ + auVar134._28_4_;
                                  auVar102 = vfmsub231ps_fma(auVar41,local_2740,auVar182);
                                  fVar215 = local_2720._0_4_;
                                  fVar218 = local_2720._4_4_;
                                  auVar42._4_4_ = fVar218 * auVar182._4_4_;
                                  auVar42._0_4_ = fVar215 * auVar182._0_4_;
                                  fVar219 = local_2720._8_4_;
                                  auVar42._8_4_ = fVar219 * auVar182._8_4_;
                                  fVar220 = local_2720._12_4_;
                                  auVar42._12_4_ = fVar220 * auVar182._12_4_;
                                  fVar221 = local_2720._16_4_;
                                  auVar42._16_4_ = fVar221 * auVar182._16_4_;
                                  fVar222 = local_2720._20_4_;
                                  auVar42._20_4_ = fVar222 * auVar182._20_4_;
                                  fVar223 = local_2720._24_4_;
                                  auVar42._24_4_ = fVar223 * auVar182._24_4_;
                                  auVar42._28_4_ = auVar182._28_4_;
                                  auVar83 = vfmsub231ps_fma(auVar42,local_2760,auVar170);
                                  auVar183._0_4_ = (float)local_2ee0._4_4_ * auVar83._0_4_;
                                  auVar183._4_4_ = (float)local_2ee0._4_4_ * auVar83._4_4_;
                                  auVar183._8_4_ = (float)local_2ee0._4_4_ * auVar83._8_4_;
                                  auVar183._12_4_ = (float)local_2ee0._4_4_ * auVar83._12_4_;
                                  auVar183._16_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar183._20_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar183._24_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar183._28_4_ = 0;
                                  auVar102 = vfmadd231ps_fma(auVar183,local_2ec0,ZEXT1632(auVar102))
                                  ;
                                  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_2e80,
                                                             ZEXT1632(auVar82));
                                  auVar174 = vsubps_avx(auVar134,auVar85);
                                  auVar157._0_4_ = auVar134._0_4_ + auVar85._0_4_;
                                  auVar157._4_4_ = auVar134._4_4_ + auVar85._4_4_;
                                  auVar157._8_4_ = auVar134._8_4_ + auVar85._8_4_;
                                  auVar157._12_4_ = auVar134._12_4_ + auVar85._12_4_;
                                  auVar157._16_4_ = auVar134._16_4_ + auVar85._16_4_;
                                  auVar157._20_4_ = auVar134._20_4_ + auVar85._20_4_;
                                  auVar157._24_4_ = auVar134._24_4_ + auVar85._24_4_;
                                  auVar157._28_4_ = auVar134._28_4_ + auVar85._28_4_;
                                  auVar207 = vsubps_avx(auVar107,auVar106);
                                  auVar190._0_4_ = auVar107._0_4_ + auVar106._0_4_;
                                  auVar190._4_4_ = auVar107._4_4_ + auVar106._4_4_;
                                  auVar190._8_4_ = auVar107._8_4_ + auVar106._8_4_;
                                  auVar190._12_4_ = auVar107._12_4_ + auVar106._12_4_;
                                  auVar190._16_4_ = auVar107._16_4_ + auVar106._16_4_;
                                  auVar190._20_4_ = auVar107._20_4_ + auVar106._20_4_;
                                  auVar190._24_4_ = auVar107._24_4_ + auVar106._24_4_;
                                  auVar190._28_4_ = auVar107._28_4_ + auVar106._28_4_;
                                  auVar106 = vsubps_avx(auVar133,auVar148);
                                  auVar141._0_4_ = auVar133._0_4_ + auVar148._0_4_;
                                  auVar141._4_4_ = auVar133._4_4_ + auVar148._4_4_;
                                  auVar141._8_4_ = auVar133._8_4_ + auVar148._8_4_;
                                  auVar141._12_4_ = auVar133._12_4_ + auVar148._12_4_;
                                  auVar141._16_4_ = auVar133._16_4_ + auVar148._16_4_;
                                  auVar141._20_4_ = auVar133._20_4_ + auVar148._20_4_;
                                  auVar141._24_4_ = auVar133._24_4_ + auVar148._24_4_;
                                  auVar141._28_4_ = fVar193 + auVar148._28_4_;
                                  auVar197._0_4_ = auVar190._0_4_ * auVar106._0_4_;
                                  auVar197._4_4_ = auVar190._4_4_ * auVar106._4_4_;
                                  auVar197._8_4_ = auVar190._8_4_ * auVar106._8_4_;
                                  auVar197._12_4_ = auVar190._12_4_ * auVar106._12_4_;
                                  auVar197._16_4_ = auVar190._16_4_ * auVar106._16_4_;
                                  auVar197._20_4_ = auVar190._20_4_ * auVar106._20_4_;
                                  auVar197._24_4_ = auVar190._24_4_ * auVar106._24_4_;
                                  auVar197._28_4_ = 0;
                                  auVar83 = vfmsub231ps_fma(auVar197,auVar207,auVar141);
                                  auVar43._4_4_ = auVar141._4_4_ * auVar174._4_4_;
                                  auVar43._0_4_ = auVar141._0_4_ * auVar174._0_4_;
                                  auVar43._8_4_ = auVar141._8_4_ * auVar174._8_4_;
                                  auVar43._12_4_ = auVar141._12_4_ * auVar174._12_4_;
                                  auVar43._16_4_ = auVar141._16_4_ * auVar174._16_4_;
                                  auVar43._20_4_ = auVar141._20_4_ * auVar174._20_4_;
                                  auVar43._24_4_ = auVar141._24_4_ * auVar174._24_4_;
                                  auVar43._28_4_ = auVar141._28_4_;
                                  auVar82 = vfmsub231ps_fma(auVar43,auVar106,auVar157);
                                  auVar44._4_4_ = auVar207._4_4_ * auVar157._4_4_;
                                  auVar44._0_4_ = auVar207._0_4_ * auVar157._0_4_;
                                  auVar44._8_4_ = auVar207._8_4_ * auVar157._8_4_;
                                  auVar44._12_4_ = auVar207._12_4_ * auVar157._12_4_;
                                  auVar44._16_4_ = auVar207._16_4_ * auVar157._16_4_;
                                  auVar44._20_4_ = auVar207._20_4_ * auVar157._20_4_;
                                  auVar44._24_4_ = auVar207._24_4_ * auVar157._24_4_;
                                  auVar44._28_4_ = auVar157._28_4_;
                                  auVar103 = vfmsub231ps_fma(auVar44,auVar174,auVar190);
                                  local_2ee0._0_4_ = local_2ee0._4_4_;
                                  fStack_2ed8 = (float)local_2ee0._4_4_;
                                  fStack_2ed4 = (float)local_2ee0._4_4_;
                                  fStack_2ed0 = (float)local_2ee0._4_4_;
                                  fStack_2ecc = (float)local_2ee0._4_4_;
                                  fStack_2ec8 = (float)local_2ee0._4_4_;
                                  fStack_2ec4 = (float)local_2ee0._4_4_;
                                  auVar158._0_4_ = (float)local_2ee0._4_4_ * auVar103._0_4_;
                                  auVar158._4_4_ = (float)local_2ee0._4_4_ * auVar103._4_4_;
                                  auVar158._8_4_ = (float)local_2ee0._4_4_ * auVar103._8_4_;
                                  auVar158._12_4_ = (float)local_2ee0._4_4_ * auVar103._12_4_;
                                  auVar158._16_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar158._20_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar158._24_4_ = (float)local_2ee0._4_4_ * 0.0;
                                  auVar158._28_4_ = 0;
                                  auVar82 = vfmadd231ps_fma(auVar158,local_2ec0,ZEXT1632(auVar82));
                                  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),local_2e80,
                                                            ZEXT1632(auVar83));
                                  fVar205 = auVar82._0_4_ + auVar81._0_4_ + auVar102._0_4_;
                                  fVar211 = auVar82._4_4_ + auVar81._4_4_ + auVar102._4_4_;
                                  fVar212 = auVar82._8_4_ + auVar81._8_4_ + auVar102._8_4_;
                                  fVar213 = auVar82._12_4_ + auVar81._12_4_ + auVar102._12_4_;
                                  local_2e60 = ZEXT1632(CONCAT412(fVar213,CONCAT48(fVar212,CONCAT44(
                                                  fVar211,fVar205))));
                                  auVar208 = ZEXT1632(auVar81);
                                  auVar134 = vminps_avx(auVar208,ZEXT1632(auVar102));
                                  auVar134 = vminps_avx(auVar134,ZEXT1632(auVar82));
                                  local_2800 = vandps_avx(local_2e60,local_2d20);
                                  fVar193 = local_2800._0_4_ * 1.1920929e-07;
                                  fVar199 = local_2800._4_4_ * 1.1920929e-07;
                                  auVar45._4_4_ = fVar199;
                                  auVar45._0_4_ = fVar193;
                                  fVar200 = local_2800._8_4_ * 1.1920929e-07;
                                  auVar45._8_4_ = fVar200;
                                  fVar201 = local_2800._12_4_ * 1.1920929e-07;
                                  auVar45._12_4_ = fVar201;
                                  fVar202 = local_2800._16_4_ * 1.1920929e-07;
                                  auVar45._16_4_ = fVar202;
                                  fVar203 = local_2800._20_4_ * 1.1920929e-07;
                                  auVar45._20_4_ = fVar203;
                                  fVar204 = local_2800._24_4_ * 1.1920929e-07;
                                  auVar45._24_4_ = fVar204;
                                  auVar45._28_4_ = 0x34000000;
                                  auVar191._0_8_ = CONCAT44(fVar199,fVar193) ^ 0x8000000080000000;
                                  auVar191._8_4_ = -fVar200;
                                  auVar191._12_4_ = -fVar201;
                                  auVar191._16_4_ = -fVar202;
                                  auVar191._20_4_ = -fVar203;
                                  auVar191._24_4_ = -fVar204;
                                  auVar191._28_4_ = 0xb4000000;
                                  auVar134 = vcmpps_avx(auVar134,auVar191,5);
                                  auVar148 = ZEXT1632(auVar102);
                                  auVar85 = vmaxps_avx(auVar208,auVar148);
                                  auVar107 = vmaxps_avx(auVar85,ZEXT1632(auVar82));
                                  auVar107 = vcmpps_avx(auVar107,auVar45,2);
                                  auVar134 = vorps_avx(auVar134,auVar107);
                                  local_2dc8 = lVar65;
                                  if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar134 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar134 >> 0x5f & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar134 >> 0x7f,0) != '\0') ||
                                        (auVar134 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || SUB321(auVar134 >> 0xbf,0) != '\0'
                                       ) || (auVar134 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) || auVar134[0x1f] < '\0') {
                                    auVar46._4_4_ = local_26e0._4_4_ * fVar218;
                                    auVar46._0_4_ = local_26e0._0_4_ * fVar215;
                                    auVar46._8_4_ = local_26e0._8_4_ * fVar219;
                                    auVar46._12_4_ = local_26e0._12_4_ * fVar220;
                                    auVar46._16_4_ = local_26e0._16_4_ * fVar221;
                                    auVar46._20_4_ = local_26e0._20_4_ * fVar222;
                                    auVar46._24_4_ = local_26e0._24_4_ * fVar223;
                                    auVar46._28_4_ = auVar107._28_4_;
                                    in_ZMM14 = ZEXT3264(local_2760);
                                    auVar47._4_4_ = fVar98 * local_2700._4_4_;
                                    auVar47._0_4_ = fVar96 * local_2700._0_4_;
                                    auVar47._8_4_ = fVar100 * local_2700._8_4_;
                                    auVar47._12_4_ = fVar18 * local_2700._12_4_;
                                    auVar47._16_4_ = fVar20 * local_2700._16_4_;
                                    auVar47._20_4_ = fVar22 * local_2700._20_4_;
                                    auVar47._24_4_ = fVar24 * local_2700._24_4_;
                                    auVar47._28_4_ = auVar85._28_4_;
                                    auVar81 = vfmsub213ps_fma(local_2700,local_2740,auVar46);
                                    auVar48._4_4_ = auVar207._4_4_ * fVar97;
                                    auVar48._0_4_ = auVar207._0_4_ * fVar80;
                                    auVar48._8_4_ = auVar207._8_4_ * fVar99;
                                    auVar48._12_4_ = auVar207._12_4_ * fVar101;
                                    auVar48._16_4_ = auVar207._16_4_ * fVar19;
                                    auVar48._20_4_ = auVar207._20_4_ * fVar21;
                                    auVar48._24_4_ = auVar207._24_4_ * fVar23;
                                    auVar48._28_4_ = 0x34000000;
                                    auVar49._4_4_ = fVar98 * auVar106._4_4_;
                                    auVar49._0_4_ = fVar96 * auVar106._0_4_;
                                    auVar49._8_4_ = fVar100 * auVar106._8_4_;
                                    auVar49._12_4_ = fVar18 * auVar106._12_4_;
                                    auVar49._16_4_ = fVar20 * auVar106._16_4_;
                                    auVar49._20_4_ = fVar22 * auVar106._20_4_;
                                    auVar49._24_4_ = fVar24 * auVar106._24_4_;
                                    auVar49._28_4_ = local_2800._28_4_;
                                    auVar82 = vfmsub213ps_fma(auVar106,local_2720,auVar48);
                                    auVar107 = vandps_avx(local_2d20,auVar46);
                                    auVar85 = vandps_avx(auVar48,local_2d20);
                                    auVar107 = vcmpps_avx(auVar107,auVar85,1);
                                    auVar106 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar81),
                                                             auVar107);
                                    auVar93._0_4_ = auVar174._0_4_ * fVar215;
                                    auVar93._4_4_ = auVar174._4_4_ * fVar218;
                                    auVar93._8_4_ = auVar174._8_4_ * fVar219;
                                    auVar93._12_4_ = auVar174._12_4_ * fVar220;
                                    auVar93._16_4_ = auVar174._16_4_ * fVar221;
                                    auVar93._20_4_ = auVar174._20_4_ * fVar222;
                                    auVar93._24_4_ = auVar174._24_4_ * fVar223;
                                    auVar93._28_4_ = 0;
                                    auVar81 = vfmsub213ps_fma(auVar174,local_2740,auVar49);
                                    auVar50._4_4_ = local_26c0._4_4_ * fVar97;
                                    auVar50._0_4_ = local_26c0._0_4_ * fVar80;
                                    auVar50._8_4_ = local_26c0._8_4_ * fVar99;
                                    auVar50._12_4_ = local_26c0._12_4_ * fVar101;
                                    auVar50._16_4_ = local_26c0._16_4_ * fVar19;
                                    auVar50._20_4_ = local_26c0._20_4_ * fVar21;
                                    auVar50._24_4_ = local_26c0._24_4_ * fVar23;
                                    auVar50._28_4_ = auVar107._28_4_;
                                    auVar82 = vfmsub213ps_fma(local_26e0,local_2760,auVar50);
                                    auVar107 = vandps_avx(local_2d20,auVar50);
                                    auVar85 = vandps_avx(auVar49,local_2d20);
                                    auVar107 = vcmpps_avx(auVar107,auVar85,1);
                                    auVar174 = vblendvps_avx(ZEXT1632(auVar81),ZEXT1632(auVar82),
                                                             auVar107);
                                    auVar81 = vfmsub213ps_fma(local_26c0,local_2720,auVar47);
                                    auVar82 = vfmsub213ps_fma(auVar207,local_2760,auVar93);
                                    auVar107 = vandps_avx(local_2d20,auVar47);
                                    auVar85 = vandps_avx(local_2d20,auVar93);
                                    auVar107 = vcmpps_avx(auVar107,auVar85,1);
                                    auVar107 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar81),
                                                             auVar107);
                                    auVar81 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
                                    fVar80 = auVar107._0_4_;
                                    auVar112._0_4_ = fVar80 * (float)local_2ee0._4_4_;
                                    fVar96 = auVar107._4_4_;
                                    auVar112._4_4_ = fVar96 * (float)local_2ee0._4_4_;
                                    fVar97 = auVar107._8_4_;
                                    auVar112._8_4_ = fVar97 * (float)local_2ee0._4_4_;
                                    fVar98 = auVar107._12_4_;
                                    auVar112._12_4_ = fVar98 * (float)local_2ee0._4_4_;
                                    fVar99 = auVar107._16_4_;
                                    auVar112._16_4_ = fVar99 * (float)local_2ee0._4_4_;
                                    fVar100 = auVar107._20_4_;
                                    auVar112._20_4_ = fVar100 * (float)local_2ee0._4_4_;
                                    fVar101 = auVar107._24_4_;
                                    auVar112._24_4_ = fVar101 * (float)local_2ee0._4_4_;
                                    auVar112._28_4_ = 0;
                                    auVar82 = vfmadd213ps_fma(local_2ec0,auVar174,auVar112);
                                    auVar82 = vfmadd213ps_fma(local_2e80,auVar106,ZEXT1632(auVar82))
                                    ;
                                    auVar142 = ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                                  CONCAT48(auVar82._8_4_ +
                                                                           auVar82._8_4_,
                                                                           CONCAT44(auVar82._4_4_ +
                                                                                    auVar82._4_4_,
                                                                                    auVar82._0_4_ +
                                                                                    auVar82._0_4_)))
                                                       );
                                    auVar113._0_4_ = fVar80 * fVar1;
                                    auVar113._4_4_ = fVar96 * fVar2;
                                    auVar113._8_4_ = fVar97 * fVar13;
                                    auVar113._12_4_ = fVar98 * fVar14;
                                    auVar113._16_4_ = fVar99 * fVar15;
                                    auVar113._20_4_ = fVar100 * fVar16;
                                    auVar113._24_4_ = fVar101 * fVar17;
                                    auVar113._28_4_ = 0;
                                    auVar82 = vfmadd213ps_fma(local_2680,auVar174,auVar113);
                                    auVar83 = vfmadd213ps_fma(local_2ea0,auVar106,ZEXT1632(auVar82))
                                    ;
                                    auVar134 = vrcpps_avx(auVar142);
                                    auVar210._8_4_ = 0x3f800000;
                                    auVar210._0_8_ = &DAT_3f8000003f800000;
                                    auVar210._12_4_ = 0x3f800000;
                                    auVar210._16_4_ = 0x3f800000;
                                    auVar210._20_4_ = 0x3f800000;
                                    auVar210._24_4_ = 0x3f800000;
                                    auVar210._28_4_ = 0x3f800000;
                                    auVar82 = vfnmadd213ps_fma(auVar134,auVar142,auVar210);
                                    auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar134,auVar134);
                                    auVar207 = ZEXT1632(CONCAT412(auVar82._12_4_ *
                                                                  (auVar83._12_4_ + auVar83._12_4_),
                                                                  CONCAT48(auVar82._8_4_ *
                                                                           (auVar83._8_4_ +
                                                                           auVar83._8_4_),
                                                                           CONCAT44(auVar82._4_4_ *
                                                                                    (auVar83._4_4_ +
                                                                                    auVar83._4_4_),
                                                                                    auVar82._0_4_ *
                                                                                    (auVar83._0_4_ +
                                                                                    auVar83._0_4_)))
                                                                 ));
                                    uVar76 = *(undefined4 *)(local_2e00 + lVar65 * 4 + 0x60);
                                    auVar192._4_4_ = uVar76;
                                    auVar192._0_4_ = uVar76;
                                    auVar192._8_4_ = uVar76;
                                    auVar192._12_4_ = uVar76;
                                    auVar192._16_4_ = uVar76;
                                    auVar192._20_4_ = uVar76;
                                    auVar192._24_4_ = uVar76;
                                    auVar192._28_4_ = uVar76;
                                    uVar76 = *(undefined4 *)(local_2e00 + lVar65 * 4 + 0x100);
                                    auVar198._4_4_ = uVar76;
                                    auVar198._0_4_ = uVar76;
                                    auVar198._8_4_ = uVar76;
                                    auVar198._12_4_ = uVar76;
                                    auVar198._16_4_ = uVar76;
                                    auVar198._20_4_ = uVar76;
                                    auVar198._24_4_ = uVar76;
                                    auVar198._28_4_ = uVar76;
                                    auVar134 = vcmpps_avx(auVar192,auVar207,2);
                                    auVar85 = vcmpps_avx(auVar207,auVar198,2);
                                    auVar134 = vandps_avx(auVar85,auVar134);
                                    auVar82 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
                                    auVar81 = vpand_avx(auVar82,auVar81);
                                    auVar134 = vpmovsxwd_avx2(auVar81);
                                    auVar133 = local_2e60;
                                    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar134 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar134 >> 0x5f & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar134 >> 0x7f,0) != '\0') ||
                                          (auVar134 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) ||
                                         SUB321(auVar134 >> 0xbf,0) != '\0') ||
                                        (auVar134 & (undefined1  [32])0x100000000) !=
                                        (undefined1  [32])0x0) || auVar134[0x1f] < '\0') {
                                      auVar134 = vcmpps_avx(auVar142,_DAT_02020f00,4);
                                      auVar82 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
                                      auVar81 = vpand_avx(auVar81,auVar82);
                                      auVar134 = vpmovsxwd_avx2(auVar81);
                                      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar134 >> 0x3f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar134 >> 0x5f & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             SUB321(auVar134 >> 0x7f,0) != '\0') ||
                                            (auVar134 & (undefined1  [32])0x100000000) !=
                                            (undefined1  [32])0x0) ||
                                           SUB321(auVar134 >> 0xbf,0) != '\0') ||
                                          (auVar134 & (undefined1  [32])0x100000000) !=
                                          (undefined1  [32])0x0) || auVar134[0x1f] < '\0') {
                                        local_2ca0 = local_2e60;
                                        local_2c80 = &local_2f16;
                                        local_2c60 = auVar134;
                                        local_2c00 = auVar207;
                                        auVar85 = vsubps_avx(local_2e60,auVar148);
                                        auVar85 = vblendvps_avx(auVar208,auVar85,local_27c0);
                                        auVar207 = vsubps_avx(local_2e60,auVar208);
                                        auVar148 = vblendvps_avx(auVar148,auVar207,local_27c0);
                                        local_2be0[0] = (float)local_27e0._0_4_ * auVar106._0_4_;
                                        local_2be0[1] = (float)local_27e0._4_4_ * auVar106._4_4_;
                                        local_2be0[2] = fStack_27d8 * auVar106._8_4_;
                                        local_2be0[3] = fStack_27d4 * auVar106._12_4_;
                                        fStack_2bd0 = fStack_27d0 * auVar106._16_4_;
                                        fStack_2bcc = fStack_27cc * auVar106._20_4_;
                                        fStack_2bc8 = fStack_27c8 * auVar106._24_4_;
                                        uStack_2bc4 = auVar106._28_4_;
                                        local_2bc0[0] = (float)local_27e0._0_4_ * auVar174._0_4_;
                                        local_2bc0[1] = (float)local_27e0._4_4_ * auVar174._4_4_;
                                        local_2bc0[2] = fStack_27d8 * auVar174._8_4_;
                                        local_2bc0[3] = fStack_27d4 * auVar174._12_4_;
                                        fStack_2bb0 = fStack_27d0 * auVar174._16_4_;
                                        fStack_2bac = fStack_27cc * auVar174._20_4_;
                                        fStack_2ba8 = fStack_27c8 * auVar174._24_4_;
                                        uStack_2ba4 = auVar106._28_4_;
                                        local_2ba0[0] = (float)local_27e0._0_4_ * fVar80;
                                        local_2ba0[1] = (float)local_27e0._4_4_ * fVar96;
                                        local_2ba0[2] = fStack_27d8 * fVar97;
                                        local_2ba0[3] = fStack_27d4 * fVar98;
                                        fStack_2b90 = fStack_27d0 * fVar99;
                                        fStack_2b8c = fStack_27cc * fVar100;
                                        fStack_2b88 = fStack_27c8 * fVar101;
                                        uStack_2b84 = auVar107._28_4_;
                                        auVar84._0_4_ =
                                             (float)(int)(*(ushort *)(local_2dd8 + 8 + local_2de0) -
                                                         1);
                                        auVar84._4_12_ = auVar102._4_12_;
                                        auVar81 = vrcpss_avx(auVar84,auVar84);
                                        auVar147._0_4_ =
                                             (float)(int)(*(ushort *)(local_2dd8 + 10 + local_2de0)
                                                         - 1);
                                        auVar147._4_12_ = auVar102._4_12_;
                                        auVar102 = vfnmadd213ss_fma(auVar84,auVar81,
                                                                    SUB6416(ZEXT464(0x40000000),0));
                                        fStack_2cc4 = auVar81._0_4_ * auVar102._0_4_;
                                        auVar81 = vrcpss_avx(auVar147,auVar147);
                                        auVar102 = vfnmadd213ss_fma(auVar147,auVar81,
                                                                    SUB6416(ZEXT464(0x40000000),0));
                                        fStack_2ca8 = auVar81._0_4_ * auVar102._0_4_;
                                        local_2ce0._0_4_ =
                                             (fVar205 * (float)local_2780._0_4_ + auVar85._0_4_) *
                                             fStack_2cc4;
                                        local_2ce0._4_4_ =
                                             (fVar211 * (float)local_2780._4_4_ + auVar85._4_4_) *
                                             fStack_2cc4;
                                        fStack_2cd8 = (fVar212 * fStack_2778 + auVar85._8_4_) *
                                                      fStack_2cc4;
                                        fStack_2cd4 = (fVar213 * fStack_2774 + auVar85._12_4_) *
                                                      fStack_2cc4;
                                        fStack_2cd0 = (fStack_2770 * 0.0 + auVar85._16_4_) *
                                                      fStack_2cc4;
                                        fStack_2ccc = (fStack_276c * 0.0 + auVar85._20_4_) *
                                                      fStack_2cc4;
                                        fStack_2cc8 = (fStack_2768 * 0.0 + auVar85._24_4_) *
                                                      fStack_2cc4;
                                        local_2cc0._0_4_ =
                                             (fVar205 * (float)local_27a0._0_4_ + auVar148._0_4_) *
                                             fStack_2ca8;
                                        local_2cc0._4_4_ =
                                             (fVar211 * (float)local_27a0._4_4_ + auVar148._4_4_) *
                                             fStack_2ca8;
                                        fStack_2cb8 = (fVar212 * fStack_2798 + auVar148._8_4_) *
                                                      fStack_2ca8;
                                        fStack_2cb4 = (fVar213 * fStack_2794 + auVar148._12_4_) *
                                                      fStack_2ca8;
                                        fStack_2cb0 = (fStack_2790 * 0.0 + auVar148._16_4_) *
                                                      fStack_2ca8;
                                        fStack_2cac = (fStack_278c * 0.0 + auVar148._20_4_) *
                                                      fStack_2ca8;
                                        fStack_2ca8 = (fStack_2788 * 0.0 + auVar148._24_4_) *
                                                      fStack_2ca8;
                                        fStack_2ca4 = auVar85._28_4_ + 0.0 + auVar148._28_4_;
                                        pGVar7 = (local_2dd0->geometries).items[local_2de8].ptr;
                                        if ((pGVar7->mask &
                                            *(uint *)(local_2e00 + lVar65 * 4 + 0x120)) != 0) {
                                          if ((local_2df8->args->filter == (RTCFilterFunctionN)0x0)
                                             && (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0
                                                )) {
LAB_005cb4e5:
                                            *(undefined4 *)(local_2d00 + lVar65 * 4) = 0;
                                            auVar133 = local_2e60;
                                          }
                                          else {
                                            auVar107 = vrcpps_avx(local_2e60);
                                            auVar143._8_4_ = 0x3f800000;
                                            auVar143._0_8_ = &DAT_3f8000003f800000;
                                            auVar143._12_4_ = 0x3f800000;
                                            auVar143._16_4_ = 0x3f800000;
                                            auVar143._20_4_ = 0x3f800000;
                                            auVar143._24_4_ = 0x3f800000;
                                            auVar143._28_4_ = 0x3f800000;
                                            auVar81 = vfnmadd213ps_fma(local_2e60,auVar107,auVar143)
                                            ;
                                            auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar107,
                                                                      auVar107);
                                            auVar124._8_4_ = 0x219392ef;
                                            auVar124._0_8_ = 0x219392ef219392ef;
                                            auVar124._12_4_ = 0x219392ef;
                                            auVar124._16_4_ = 0x219392ef;
                                            auVar124._20_4_ = 0x219392ef;
                                            auVar124._24_4_ = 0x219392ef;
                                            auVar124._28_4_ = 0x219392ef;
                                            auVar107 = vcmpps_avx(local_2800,auVar124,5);
                                            auVar107 = vandps_avx(ZEXT1632(auVar81),auVar107);
                                            auVar51._4_4_ = (float)local_2ce0._4_4_ * auVar107._4_4_
                                            ;
                                            auVar51._0_4_ = (float)local_2ce0._0_4_ * auVar107._0_4_
                                            ;
                                            auVar51._8_4_ = fStack_2cd8 * auVar107._8_4_;
                                            auVar51._12_4_ = fStack_2cd4 * auVar107._12_4_;
                                            auVar51._16_4_ = fStack_2cd0 * auVar107._16_4_;
                                            auVar51._20_4_ = fStack_2ccc * auVar107._20_4_;
                                            auVar51._24_4_ = fStack_2cc8 * auVar107._24_4_;
                                            auVar51._28_4_ = fStack_2cc4;
                                            local_2c40 = vminps_avx(auVar51,auVar143);
                                            auVar52._4_4_ = (float)local_2cc0._4_4_ * auVar107._4_4_
                                            ;
                                            auVar52._0_4_ = (float)local_2cc0._0_4_ * auVar107._0_4_
                                            ;
                                            auVar52._8_4_ = fStack_2cb8 * auVar107._8_4_;
                                            auVar52._12_4_ = fStack_2cb4 * auVar107._12_4_;
                                            auVar52._16_4_ = fStack_2cb0 * auVar107._16_4_;
                                            auVar52._20_4_ = fStack_2cac * auVar107._20_4_;
                                            auVar52._24_4_ = fStack_2ca8 * auVar107._24_4_;
                                            auVar52._28_4_ = local_2c40._28_4_;
                                            local_2c20 = vminps_avx(auVar52,auVar143);
                                            uVar66 = vmovmskps_avx(auVar134);
                                            local_2e80[0] = uVar66 == 0;
                                            if (uVar66 != 0) {
                                              uVar75 = 0;
                                              uVar73 = (ulong)(uVar66 & 0xff);
                                              for (uVar68 = uVar73; (uVar68 & 1) == 0;
                                                  uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                                                uVar75 = uVar75 + 1;
                                              }
                                              iVar62 = 1 << ((uint)lVar65 & 0x1f);
                                              auVar94._4_4_ = iVar62;
                                              auVar94._0_4_ = iVar62;
                                              auVar94._8_4_ = iVar62;
                                              auVar94._12_4_ = iVar62;
                                              auVar94._16_4_ = iVar62;
                                              auVar94._20_4_ = iVar62;
                                              auVar94._24_4_ = iVar62;
                                              auVar94._28_4_ = iVar62;
                                              auVar107 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201))
                                              ;
                                              auVar134 = vpand_avx2(auVar94,auVar107);
                                              local_2e60 = vpcmpeqd_avx2(auVar134,auVar107);
                                              do {
                                                uVar76 = *(undefined4 *)(ray + lVar65 * 4 + 0x100);
                                                local_2960 = *(undefined4 *)
                                                              (local_2c40 + uVar75 * 4);
                                                local_2940 = *(undefined4 *)
                                                              (local_2c20 + uVar75 * 4);
                                                *(float *)(ray + lVar65 * 4 + 0x100) =
                                                     local_2be0[uVar75 - 8];
                                                fVar1 = local_2be0[uVar75];
                                                auVar125._4_4_ = fVar1;
                                                auVar125._0_4_ = fVar1;
                                                auVar125._8_4_ = fVar1;
                                                auVar125._12_4_ = fVar1;
                                                auVar125._16_4_ = fVar1;
                                                auVar125._20_4_ = fVar1;
                                                auVar125._24_4_ = fVar1;
                                                auVar125._28_4_ = fVar1;
                                                fVar2 = local_2bc0[uVar75];
                                                local_29a0._4_4_ = fVar2;
                                                local_29a0._0_4_ = fVar2;
                                                local_29a0._8_4_ = fVar2;
                                                local_29a0._12_4_ = fVar2;
                                                local_29a0._16_4_ = fVar2;
                                                local_29a0._20_4_ = fVar2;
                                                local_29a0._24_4_ = fVar2;
                                                local_29a0._28_4_ = fVar2;
                                                fVar2 = local_2ba0[uVar75];
                                                local_2980._4_4_ = fVar2;
                                                local_2980._0_4_ = fVar2;
                                                local_2980._8_4_ = fVar2;
                                                local_2980._12_4_ = fVar2;
                                                local_2980._16_4_ = fVar2;
                                                local_2980._20_4_ = fVar2;
                                                local_2980._24_4_ = fVar2;
                                                local_2980._28_4_ = fVar2;
                                                local_2d90.context = context->user;
                                                local_29c0[0] = (RTCHitN)SUB41(fVar1,0);
                                                local_29c0[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
                                                local_29c0[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10)
                                                ;
                                                local_29c0[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18)
                                                ;
                                                local_29c0[4] = (RTCHitN)SUB41(fVar1,0);
                                                local_29c0[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
                                                local_29c0[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10)
                                                ;
                                                local_29c0[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18)
                                                ;
                                                local_29c0[8] = (RTCHitN)SUB41(fVar1,0);
                                                local_29c0[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
                                                local_29c0[10] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x10);
                                                local_29c0[0xb] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x18);
                                                local_29c0[0xc] = (RTCHitN)SUB41(fVar1,0);
                                                local_29c0[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
                                                local_29c0[0xe] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x10);
                                                local_29c0[0xf] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x18);
                                                local_29c0[0x10] = (RTCHitN)SUB41(fVar1,0);
                                                local_29c0[0x11] = (RTCHitN)(char)((uint)fVar1 >> 8)
                                                ;
                                                local_29c0[0x12] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x10);
                                                local_29c0[0x13] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x18);
                                                local_29c0[0x14] = (RTCHitN)SUB41(fVar1,0);
                                                local_29c0[0x15] = (RTCHitN)(char)((uint)fVar1 >> 8)
                                                ;
                                                local_29c0[0x16] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x10);
                                                local_29c0[0x17] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x18);
                                                local_29c0[0x18] = (RTCHitN)SUB41(fVar1,0);
                                                local_29c0[0x19] = (RTCHitN)(char)((uint)fVar1 >> 8)
                                                ;
                                                local_29c0[0x1a] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x10);
                                                local_29c0[0x1b] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x18);
                                                local_29c0[0x1c] = (RTCHitN)SUB41(fVar1,0);
                                                local_29c0[0x1d] = (RTCHitN)(char)((uint)fVar1 >> 8)
                                                ;
                                                local_29c0[0x1e] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x10);
                                                local_29c0[0x1f] =
                                                     (RTCHitN)(char)((uint)fVar1 >> 0x18);
                                                uStack_295c = local_2960;
                                                uStack_2958 = local_2960;
                                                uStack_2954 = local_2960;
                                                uStack_2950 = local_2960;
                                                uStack_294c = local_2960;
                                                uStack_2948 = local_2960;
                                                uStack_2944 = local_2960;
                                                uStack_293c = local_2940;
                                                uStack_2938 = local_2940;
                                                uStack_2934 = local_2940;
                                                uStack_2930 = local_2940;
                                                uStack_292c = local_2940;
                                                uStack_2928 = local_2940;
                                                uStack_2924 = local_2940;
                                                local_2920 = CONCAT44(uStack_287c,local_2880);
                                                uStack_2918 = CONCAT44(uStack_2874,uStack_2878);
                                                uStack_2910 = CONCAT44(uStack_286c,uStack_2870);
                                                uStack_2908 = CONCAT44(uStack_2864,uStack_2868);
                                                local_2900 = CONCAT44(uStack_285c,local_2860);
                                                uStack_28f8 = CONCAT44(uStack_2854,uStack_2858);
                                                uStack_28f0 = CONCAT44(uStack_284c,uStack_2850);
                                                uStack_28e8 = CONCAT44(uStack_2844,uStack_2848);
                                                auVar134 = vpcmpeqd_avx2(auVar125,auVar125);
                                                local_28e0._4_4_ = (local_2d90.context)->instID[0];
                                                local_28e0._0_4_ = local_28e0._4_4_;
                                                local_28e0._8_4_ = local_28e0._4_4_;
                                                local_28e0._12_4_ = local_28e0._4_4_;
                                                local_28e0._16_4_ = local_28e0._4_4_;
                                                local_28e0._20_4_ = local_28e0._4_4_;
                                                local_28e0._24_4_ = local_28e0._4_4_;
                                                local_28e0._28_4_ = local_28e0._4_4_;
                                                local_28c0._4_4_ =
                                                     (local_2d90.context)->instPrimID[0];
                                                local_28c0._0_4_ = local_28c0._4_4_;
                                                local_28c0._8_4_ = local_28c0._4_4_;
                                                local_28c0._12_4_ = local_28c0._4_4_;
                                                local_28c0._16_4_ = local_28c0._4_4_;
                                                local_28c0._20_4_ = local_28c0._4_4_;
                                                local_28c0._24_4_ = local_28c0._4_4_;
                                                local_28c0._28_4_ = local_28c0._4_4_;
                                                local_2d40 = local_2e60._0_8_;
                                                uStack_2d38 = local_2e60._8_8_;
                                                uStack_2d30 = local_2e60._16_8_;
                                                uStack_2d28 = local_2e60._24_8_;
                                                local_2d90.valid = (int *)&local_2d40;
                                                local_2d90.geometryUserPtr = pGVar7->userPtr;
                                                local_2d90.ray = (RTCRayN *)ray;
                                                local_2d90.hit = local_29c0;
                                                local_2d90.N = 8;
                                                uVar68 = uVar75;
                                                if (pGVar7->occlusionFilterN !=
                                                    (RTCFilterFunctionN)0x0) {
                                                  local_2ea0._0_8_ = uVar73;
                                                  local_2ec0._0_8_ = uVar75;
                                                  local_2ee0._0_4_ = uVar76;
                                                  auVar134 = ZEXT1632(auVar134._0_16_);
                                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                                  (*pGVar7->occlusionFilterN)(&local_2d90);
                                                  auVar134 = vpcmpeqd_avx2(auVar134,auVar134);
                                                  uVar73 = local_2ea0._0_8_;
                                                  uVar68 = local_2ec0._0_8_;
                                                  uVar76 = local_2ee0._0_4_;
                                                }
                                                auVar53._8_8_ = uStack_2d38;
                                                auVar53._0_8_ = local_2d40;
                                                auVar53._16_8_ = uStack_2d30;
                                                auVar53._24_8_ = uStack_2d28;
                                                auVar85 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1
                                                                                           [16])0x0)
                                                                                ,0),auVar53);
                                                auVar107 = auVar134 & ~auVar85;
                                                if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1)
                                                          == (undefined1  [32])0x0 &&
                                                         (auVar107 >> 0x3f & (undefined1  [32])0x1)
                                                         == (undefined1  [32])0x0) &&
                                                        (auVar107 >> 0x5f & (undefined1  [32])0x1)
                                                        == (undefined1  [32])0x0) &&
                                                       SUB321(auVar107 >> 0x7f,0) == '\0') &&
                                                      (auVar107 & (undefined1  [32])0x100000000) ==
                                                      (undefined1  [32])0x0) &&
                                                     SUB321(auVar107 >> 0xbf,0) == '\0') &&
                                                    (auVar107 & (undefined1  [32])0x100000000) ==
                                                    (undefined1  [32])0x0) && -1 < auVar107[0x1f]) {
                                                  auVar85 = auVar85 ^ auVar134;
                                                }
                                                else {
                                                  p_Var12 = context->args->filter;
                                                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                                     (((context->args->flags &
                                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                      (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                                                  {
                                                    local_2ea0._0_8_ = uVar73;
                                                    local_2ec0._0_8_ = uVar68;
                                                    local_2ee0._0_4_ = uVar76;
                                                    auVar134 = ZEXT1632(auVar134._0_16_);
                                                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                                    (*p_Var12)(&local_2d90);
                                                    auVar134 = vpcmpeqd_avx2(auVar134,auVar134);
                                                    uVar73 = local_2ea0._0_8_;
                                                    uVar68 = local_2ec0._0_8_;
                                                    uVar76 = local_2ee0._0_4_;
                                                  }
                                                  auVar54._8_8_ = uStack_2d38;
                                                  auVar54._0_8_ = local_2d40;
                                                  auVar54._16_8_ = uStack_2d30;
                                                  auVar54._24_8_ = uStack_2d28;
                                                  auVar107 = vpcmpeqd_avx2(SUB6432(ZEXT1664((
                                                  undefined1  [16])0x0),0),auVar54);
                                                  auVar85 = auVar107 ^ auVar134;
                                                  auVar126._8_4_ = 0xff800000;
                                                  auVar126._0_8_ = 0xff800000ff800000;
                                                  auVar126._12_4_ = 0xff800000;
                                                  auVar126._16_4_ = 0xff800000;
                                                  auVar126._20_4_ = 0xff800000;
                                                  auVar126._24_4_ = 0xff800000;
                                                  auVar126._28_4_ = 0xff800000;
                                                  auVar134 = vblendvps_avx(auVar126,*(undefined1
                                                                                      (*) [32])
                                                                                     (local_2d90.ray
                                                                                     + 0x100),
                                                                           auVar107);
                                                  *(undefined1 (*) [32])(local_2d90.ray + 0x100) =
                                                       auVar134;
                                                }
                                                auVar133 = local_2e60;
                                                if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1)
                                                          != (undefined1  [32])0x0 ||
                                                         (auVar85 >> 0x3f & (undefined1  [32])0x1)
                                                         != (undefined1  [32])0x0) ||
                                                        (auVar85 >> 0x5f & (undefined1  [32])0x1) !=
                                                        (undefined1  [32])0x0) ||
                                                       SUB321(auVar85 >> 0x7f,0) != '\0') ||
                                                      (auVar85 & (undefined1  [32])0x100000000) !=
                                                      (undefined1  [32])0x0) ||
                                                     SUB321(auVar85 >> 0xbf,0) != '\0') ||
                                                    (auVar85 & (undefined1  [32])0x100000000) !=
                                                    (undefined1  [32])0x0) || auVar85[0x1f] < '\0')
                                                {
                                                  if ((local_2e80 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) goto LAB_005cb4e5;
                                                  break;
                                                }
                                                *(undefined4 *)(local_2ef0 + lVar65 * 4) = uVar76;
                                                uVar75 = 0;
                                                uVar73 = uVar73 ^ 1L << (uVar68 & 0x3f);
                                                for (uVar68 = uVar73; (uVar68 & 1) == 0;
                                                    uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                                                  uVar75 = uVar75 + 1;
                                                }
                                                local_2e80[0] = uVar73 == 0;
                                              } while (uVar73 != 0);
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  local_2e60 = auVar133;
                                  uVar75 = local_2d60._0_8_ - 1 & local_2d60._0_8_;
                                  pRVar74 = ray;
                                  uVar68 = unaff_R14;
                                  pRVar78 = context;
                                } while (uVar75 != 0);
                              }
                              auVar134 = local_2820 & local_2d00;
                              bVar79 = (((((((auVar134 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0 &&
                                            (auVar134 >> 0x3f & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar134 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          SUB321(auVar134 >> 0x7f,0) == '\0') &&
                                         (auVar134 & (undefined1  [32])0x100000000) ==
                                         (undefined1  [32])0x0) &&
                                        SUB321(auVar134 >> 0xbf,0) == '\0') &&
                                       (auVar134 & (undefined1  [32])0x100000000) ==
                                       (undefined1  [32])0x0) && -1 < auVar134[0x1f];
                              auVar134 = vandps_avx(local_2d00,local_2820);
                              auVar115 = ZEXT3264(auVar134);
                              in_ZMM13 = ZEXT3264(local_2840);
                              uVar68 = local_2f10;
                              lVar65 = local_2e10;
                              puVar71 = local_2f00;
                              pauVar72 = local_2f08;
                              uVar73 = local_2e08;
                              uVar75 = local_2e18;
                              auVar134 = local_2820;
                            }
                            uVar73 = uVar73 - 1 & uVar73;
                          } while ((uVar73 != 0) && (!bVar79));
                        }
                        lVar65 = local_2e20 + 1;
                      } while (lVar65 != local_2e28);
                      auVar134 = vpcmpeqd_avx2(auVar134,auVar134);
                      auVar95._0_4_ = auVar115._0_4_ ^ auVar134._0_4_;
                      auVar95._4_4_ = auVar115._4_4_ ^ auVar134._4_4_;
                      auVar95._8_4_ = auVar115._8_4_ ^ auVar134._8_4_;
                      auVar95._12_4_ = auVar115._12_4_ ^ auVar134._12_4_;
                      auVar95._16_4_ = auVar115._16_4_ ^ auVar134._16_4_;
                      auVar95._20_4_ = auVar115._20_4_ ^ auVar134._20_4_;
                      auVar95._24_4_ = auVar115._24_4_ ^ auVar134._24_4_;
                      auVar95._28_4_ = auVar115._28_4_ ^ auVar134._28_4_;
                    }
                    local_2dc0 = vorps_avx(auVar95,local_2dc0);
                    auVar134 = auVar134 & ~local_2dc0;
                    if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar134 >> 0x7f,0) == '\0') &&
                          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar134 >> 0xbf,0) == '\0') &&
                        (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar134[0x1f]) goto LAB_005cb8c1;
                    auVar127._8_4_ = 0xff800000;
                    auVar127._0_8_ = 0xff800000ff800000;
                    auVar127._12_4_ = 0xff800000;
                    auVar127._16_4_ = 0xff800000;
                    auVar127._20_4_ = 0xff800000;
                    auVar127._24_4_ = 0xff800000;
                    auVar127._28_4_ = 0xff800000;
                    local_29e0 = vblendvps_avx(local_29e0,auVar127,local_2dc0);
                    iVar62 = 0;
                    break;
                  }
                  goto LAB_005cb8d2;
                }
                uVar63 = local_2f10 & 0xfffffffffffffff0;
                auVar134 = vcmpps_avx(local_29e0,auVar134,6);
                auVar115 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar68 = 8;
                uVar73 = 0;
                do {
                  uVar6 = *(ulong *)(uVar63 + uVar73 * 8);
                  local_2f10 = uVar68;
                  if (uVar6 != 8) {
                    auVar106 = auVar115._0_32_;
                    uVar76 = *(undefined4 *)(uVar63 + 0x80 + uVar73 * 4);
                    auVar118._4_4_ = uVar76;
                    auVar118._0_4_ = uVar76;
                    auVar118._8_4_ = uVar76;
                    auVar118._12_4_ = uVar76;
                    auVar118._16_4_ = uVar76;
                    auVar118._20_4_ = uVar76;
                    auVar118._24_4_ = uVar76;
                    auVar118._28_4_ = uVar76;
                    uVar76 = *(undefined4 *)(uVar63 + 0x20 + uVar73 * 4);
                    auVar135._4_4_ = uVar76;
                    auVar135._0_4_ = uVar76;
                    auVar135._8_4_ = uVar76;
                    auVar135._12_4_ = uVar76;
                    auVar135._16_4_ = uVar76;
                    auVar135._20_4_ = uVar76;
                    auVar135._24_4_ = uVar76;
                    auVar135._28_4_ = uVar76;
                    auVar107 = *(undefined1 (*) [32])(ray + 0xe0);
                    uVar76 = *(undefined4 *)(uVar63 + 0xa0 + uVar73 * 4);
                    auVar149._4_4_ = uVar76;
                    auVar149._0_4_ = uVar76;
                    auVar149._8_4_ = uVar76;
                    auVar149._12_4_ = uVar76;
                    auVar149._16_4_ = uVar76;
                    auVar149._20_4_ = uVar76;
                    auVar149._24_4_ = uVar76;
                    auVar149._28_4_ = uVar76;
                    auVar81 = vfmadd231ps_fma(auVar135,auVar107,auVar118);
                    uVar76 = *(undefined4 *)(uVar63 + 0x40 + uVar73 * 4);
                    auVar119._4_4_ = uVar76;
                    auVar119._0_4_ = uVar76;
                    auVar119._8_4_ = uVar76;
                    auVar119._12_4_ = uVar76;
                    auVar119._16_4_ = uVar76;
                    auVar119._20_4_ = uVar76;
                    auVar119._24_4_ = uVar76;
                    auVar119._28_4_ = uVar76;
                    auVar102 = vfmadd231ps_fma(auVar119,auVar107,auVar149);
                    uVar76 = *(undefined4 *)(uVar63 + 0xc0 + uVar73 * 4);
                    auVar150._4_4_ = uVar76;
                    auVar150._0_4_ = uVar76;
                    auVar150._8_4_ = uVar76;
                    auVar150._12_4_ = uVar76;
                    auVar150._16_4_ = uVar76;
                    auVar150._20_4_ = uVar76;
                    auVar150._24_4_ = uVar76;
                    auVar150._28_4_ = uVar76;
                    uVar76 = *(undefined4 *)(uVar63 + 0x60 + uVar73 * 4);
                    auVar163._4_4_ = uVar76;
                    auVar163._0_4_ = uVar76;
                    auVar163._8_4_ = uVar76;
                    auVar163._12_4_ = uVar76;
                    auVar163._16_4_ = uVar76;
                    auVar163._20_4_ = uVar76;
                    auVar163._24_4_ = uVar76;
                    auVar163._28_4_ = uVar76;
                    uVar76 = *(undefined4 *)(uVar63 + 0x90 + uVar73 * 4);
                    auVar175._4_4_ = uVar76;
                    auVar175._0_4_ = uVar76;
                    auVar175._8_4_ = uVar76;
                    auVar175._12_4_ = uVar76;
                    auVar175._16_4_ = uVar76;
                    auVar175._20_4_ = uVar76;
                    auVar175._24_4_ = uVar76;
                    auVar175._28_4_ = uVar76;
                    uVar76 = *(undefined4 *)(uVar63 + 0x30 + uVar73 * 4);
                    auVar186._4_4_ = uVar76;
                    auVar186._0_4_ = uVar76;
                    auVar186._8_4_ = uVar76;
                    auVar186._12_4_ = uVar76;
                    auVar186._16_4_ = uVar76;
                    auVar186._20_4_ = uVar76;
                    auVar186._24_4_ = uVar76;
                    auVar186._28_4_ = uVar76;
                    auVar82 = vfmadd231ps_fma(auVar163,auVar107,auVar150);
                    auVar83 = vfmadd231ps_fma(auVar186,auVar107,auVar175);
                    uVar76 = *(undefined4 *)(uVar63 + 0xb0 + uVar73 * 4);
                    auVar151._4_4_ = uVar76;
                    auVar151._0_4_ = uVar76;
                    auVar151._8_4_ = uVar76;
                    auVar151._12_4_ = uVar76;
                    auVar151._16_4_ = uVar76;
                    auVar151._20_4_ = uVar76;
                    auVar151._24_4_ = uVar76;
                    auVar151._28_4_ = uVar76;
                    uVar76 = *(undefined4 *)(uVar63 + 0x50 + uVar73 * 4);
                    auVar176._4_4_ = uVar76;
                    auVar176._0_4_ = uVar76;
                    auVar176._8_4_ = uVar76;
                    auVar176._12_4_ = uVar76;
                    auVar176._16_4_ = uVar76;
                    auVar176._20_4_ = uVar76;
                    auVar176._24_4_ = uVar76;
                    auVar176._28_4_ = uVar76;
                    uVar76 = *(undefined4 *)(uVar63 + 0xd0 + uVar73 * 4);
                    auVar195._4_4_ = uVar76;
                    auVar195._0_4_ = uVar76;
                    auVar195._8_4_ = uVar76;
                    auVar195._12_4_ = uVar76;
                    auVar195._16_4_ = uVar76;
                    auVar195._20_4_ = uVar76;
                    auVar195._24_4_ = uVar76;
                    auVar195._28_4_ = uVar76;
                    auVar103 = vfmadd231ps_fma(auVar176,auVar107,auVar151);
                    uVar76 = *(undefined4 *)(uVar63 + 0x70 + uVar73 * 4);
                    auVar152._4_4_ = uVar76;
                    auVar152._0_4_ = uVar76;
                    auVar152._8_4_ = uVar76;
                    auVar152._12_4_ = uVar76;
                    auVar152._16_4_ = uVar76;
                    auVar152._20_4_ = uVar76;
                    auVar152._24_4_ = uVar76;
                    auVar152._28_4_ = uVar76;
                    auVar104 = vfmadd231ps_fma(auVar152,auVar107,auVar195);
                    auVar55._8_8_ = local_2b80._8_8_;
                    auVar55._0_8_ = local_2b80._0_8_;
                    auVar55._16_8_ = local_2b80._16_8_;
                    auVar55._24_8_ = local_2b80._24_8_;
                    auVar57._8_8_ = local_2b80._40_8_;
                    auVar57._0_8_ = local_2b80._32_8_;
                    auVar57._16_8_ = local_2b80._48_8_;
                    auVar57._24_8_ = local_2b80._56_8_;
                    auVar59._8_8_ = local_2b80._72_8_;
                    auVar59._0_8_ = local_2b80._64_8_;
                    auVar59._16_8_ = local_2b80._80_8_;
                    auVar59._24_8_ = local_2b80._88_8_;
                    auVar85 = vsubps_avx(ZEXT1632(auVar81),auVar55);
                    auVar25._4_4_ = (float)local_2ac0._4_4_ * auVar85._4_4_;
                    auVar25._0_4_ = (float)local_2ac0._0_4_ * auVar85._0_4_;
                    auVar25._8_4_ = fStack_2ab8 * auVar85._8_4_;
                    auVar25._12_4_ = fStack_2ab4 * auVar85._12_4_;
                    auVar25._16_4_ = fStack_2ab0 * auVar85._16_4_;
                    auVar25._20_4_ = fStack_2aac * auVar85._20_4_;
                    auVar25._24_4_ = fStack_2aa8 * auVar85._24_4_;
                    auVar25._28_4_ = auVar85._28_4_;
                    auVar85 = vsubps_avx(ZEXT1632(auVar102),auVar57);
                    auVar115._0_4_ = local_2aa0._0_4_ * auVar85._0_4_;
                    auVar115._4_4_ = local_2aa0._4_4_ * auVar85._4_4_;
                    auVar115._8_4_ = local_2aa0._8_4_ * auVar85._8_4_;
                    auVar115._12_4_ = local_2aa0._12_4_ * auVar85._12_4_;
                    auVar115._16_4_ = local_2aa0._16_4_ * auVar85._16_4_;
                    auVar115._20_4_ = local_2aa0._20_4_ * auVar85._20_4_;
                    auVar115._28_36_ = in_ZMM13._28_36_;
                    auVar115._24_4_ = local_2aa0._24_4_ * auVar85._24_4_;
                    auVar148 = auVar115._0_32_;
                    in_ZMM13 = ZEXT3264(auVar148);
                    auVar85 = vsubps_avx(ZEXT1632(auVar82),auVar59);
                    auVar224._0_4_ = auVar85._0_4_ * (float)local_2a80._0_4_;
                    auVar224._4_4_ = auVar85._4_4_ * (float)local_2a80._4_4_;
                    auVar224._8_4_ = auVar85._8_4_ * fStack_2a78;
                    auVar224._12_4_ = auVar85._12_4_ * fStack_2a74;
                    auVar224._16_4_ = auVar85._16_4_ * fStack_2a70;
                    auVar224._20_4_ = auVar85._20_4_ * fStack_2a6c;
                    auVar224._28_36_ = in_ZMM14._28_36_;
                    auVar224._24_4_ = auVar85._24_4_ * fStack_2a68;
                    auVar174 = auVar224._0_32_;
                    in_ZMM14 = ZEXT3264(auVar174);
                    auVar85 = vsubps_avx(ZEXT1632(auVar83),auVar55);
                    auVar187._0_4_ = (float)local_2ac0._0_4_ * auVar85._0_4_;
                    auVar187._4_4_ = (float)local_2ac0._4_4_ * auVar85._4_4_;
                    auVar187._8_4_ = fStack_2ab8 * auVar85._8_4_;
                    auVar187._12_4_ = fStack_2ab4 * auVar85._12_4_;
                    auVar187._16_4_ = fStack_2ab0 * auVar85._16_4_;
                    auVar187._20_4_ = fStack_2aac * auVar85._20_4_;
                    auVar187._24_4_ = fStack_2aa8 * auVar85._24_4_;
                    auVar187._28_4_ = 0;
                    auVar85 = vsubps_avx(ZEXT1632(auVar103),auVar57);
                    auVar177._0_4_ = local_2aa0._0_4_ * auVar85._0_4_;
                    auVar177._4_4_ = local_2aa0._4_4_ * auVar85._4_4_;
                    auVar177._8_4_ = local_2aa0._8_4_ * auVar85._8_4_;
                    auVar177._12_4_ = local_2aa0._12_4_ * auVar85._12_4_;
                    auVar177._16_4_ = local_2aa0._16_4_ * auVar85._16_4_;
                    auVar177._20_4_ = local_2aa0._20_4_ * auVar85._20_4_;
                    auVar177._24_4_ = local_2aa0._24_4_ * auVar85._24_4_;
                    auVar177._28_4_ = 0;
                    auVar85 = vsubps_avx(ZEXT1632(auVar104),auVar59);
                    auVar153._0_4_ = auVar85._0_4_ * (float)local_2a80._0_4_;
                    auVar153._4_4_ = auVar85._4_4_ * (float)local_2a80._4_4_;
                    auVar153._8_4_ = auVar85._8_4_ * fStack_2a78;
                    auVar153._12_4_ = auVar85._12_4_ * fStack_2a74;
                    auVar153._16_4_ = auVar85._16_4_ * fStack_2a70;
                    auVar153._20_4_ = auVar85._20_4_ * fStack_2a6c;
                    auVar153._24_4_ = auVar85._24_4_ * fStack_2a68;
                    auVar153._28_4_ = 0;
                    auVar85 = vpminsd_avx2(auVar25,auVar187);
                    auVar133 = vpminsd_avx2(auVar148,auVar177);
                    auVar85 = vpmaxsd_avx2(auVar85,auVar133);
                    auVar133 = vpminsd_avx2(auVar174,auVar153);
                    auVar85 = vpmaxsd_avx2(auVar85,auVar133);
                    auVar26._4_4_ = auVar85._4_4_ * 0.99999964;
                    auVar26._0_4_ = auVar85._0_4_ * 0.99999964;
                    auVar26._8_4_ = auVar85._8_4_ * 0.99999964;
                    auVar26._12_4_ = auVar85._12_4_ * 0.99999964;
                    auVar26._16_4_ = auVar85._16_4_ * 0.99999964;
                    auVar26._20_4_ = auVar85._20_4_ * 0.99999964;
                    auVar26._24_4_ = auVar85._24_4_ * 0.99999964;
                    auVar26._28_4_ = auVar85._28_4_;
                    auVar85 = vpmaxsd_avx2(auVar25,auVar187);
                    auVar133 = vpmaxsd_avx2(auVar148,auVar177);
                    auVar133 = vpminsd_avx2(auVar85,auVar133);
                    auVar85 = vpmaxsd_avx2(auVar174,auVar153);
                    auVar85 = vpminsd_avx2(auVar133,auVar85);
                    auVar27._4_4_ = auVar85._4_4_ * 1.0000004;
                    auVar27._0_4_ = auVar85._0_4_ * 1.0000004;
                    auVar27._8_4_ = auVar85._8_4_ * 1.0000004;
                    auVar27._12_4_ = auVar85._12_4_ * 1.0000004;
                    auVar27._16_4_ = auVar85._16_4_ * 1.0000004;
                    auVar27._20_4_ = auVar85._20_4_ * 1.0000004;
                    auVar27._24_4_ = auVar85._24_4_ * 1.0000004;
                    auVar27._28_4_ = auVar85._28_4_;
                    auVar85 = vpmaxsd_avx2(auVar26,local_2a00);
                    auVar133 = vpminsd_avx2(auVar27,local_29e0);
                    auVar85 = vcmpps_avx(auVar85,auVar133,2);
                    if ((uVar66 & 7) == 6) {
                      uVar76 = *(undefined4 *)(uVar63 + 0xe0 + uVar73 * 4);
                      auVar154._4_4_ = uVar76;
                      auVar154._0_4_ = uVar76;
                      auVar154._8_4_ = uVar76;
                      auVar154._12_4_ = uVar76;
                      auVar154._16_4_ = uVar76;
                      auVar154._20_4_ = uVar76;
                      auVar154._24_4_ = uVar76;
                      auVar154._28_4_ = uVar76;
                      auVar133 = vcmpps_avx(auVar154,auVar107,2);
                      uVar76 = *(undefined4 *)(uVar63 + 0xf0 + uVar73 * 4);
                      auVar164._4_4_ = uVar76;
                      auVar164._0_4_ = uVar76;
                      auVar164._8_4_ = uVar76;
                      auVar164._12_4_ = uVar76;
                      auVar164._16_4_ = uVar76;
                      auVar164._20_4_ = uVar76;
                      auVar164._24_4_ = uVar76;
                      auVar164._28_4_ = uVar76;
                      auVar107 = vcmpps_avx(auVar107,auVar164,1);
                      auVar107 = vandps_avx(auVar133,auVar107);
                      auVar107 = vandps_avx(auVar107,auVar85);
                      auVar81 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
                    }
                    else {
                      auVar81 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
                    }
                    auVar102 = vpackssdw_avx(auVar134._0_16_,auVar134._16_16_);
                    auVar81 = vpand_avx(auVar81,auVar102);
                    auVar107 = vpmovzxwd_avx2(auVar81);
                    auVar107 = vpslld_avx2(auVar107,0x1f);
                    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar107 >> 0x7f,0) == '\0') &&
                          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar107 >> 0xbf,0) == '\0') &&
                        (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar107[0x1f]) {
                      auVar115 = ZEXT3264(auVar106);
                    }
                    else {
                      auVar136._8_4_ = 0x7f800000;
                      auVar136._0_8_ = 0x7f8000007f800000;
                      auVar136._12_4_ = 0x7f800000;
                      auVar136._16_4_ = 0x7f800000;
                      auVar136._20_4_ = 0x7f800000;
                      auVar136._24_4_ = 0x7f800000;
                      auVar136._28_4_ = 0x7f800000;
                      auVar107 = vblendvps_avx(auVar136,auVar26,auVar107);
                      auVar115 = ZEXT3264(auVar107);
                      local_2f10 = uVar6;
                      if (uVar68 != 8) {
                        *puVar71 = uVar68;
                        puVar71 = puVar71 + 1;
                        *pauVar72 = auVar106;
                        pauVar72 = pauVar72 + 1;
                      }
                    }
                  }
                } while ((uVar6 != 8) &&
                        (bVar79 = uVar73 < 3, uVar68 = local_2f10, uVar73 = uVar73 + 1, bVar79));
                iVar62 = 0;
                if (local_2f10 == 8) {
LAB_005ca753:
                  bVar79 = false;
                  iVar62 = 4;
                }
                else {
                  auVar134 = vcmpps_avx(local_29e0,auVar115._0_32_,6);
                  uVar76 = vmovmskps_avx(auVar134);
                  bVar79 = true;
                  if ((uint)POPCOUNT(uVar76) <= (uint)uVar75) {
                    *puVar71 = local_2f10;
                    puVar71 = puVar71 + 1;
                    *pauVar72 = auVar115._0_32_;
                    pauVar72 = pauVar72 + 1;
                    goto LAB_005ca753;
                  }
                }
              } while (bVar79);
            }
          }
        }
      } while (iVar62 != 3);
      auVar134 = vandps_avx(local_28a0,local_2dc0);
      auVar114._8_4_ = 0xff800000;
      auVar114._0_8_ = 0xff800000ff800000;
      auVar114._12_4_ = 0xff800000;
      auVar114._16_4_ = 0xff800000;
      auVar114._20_4_ = 0xff800000;
      auVar114._24_4_ = 0xff800000;
      auVar114._28_4_ = 0xff800000;
      auVar134 = vmaskmovps_avx(auVar134,auVar114);
      *(undefined1 (*) [32])local_2ef0 = auVar134;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }